

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O2

void embree::avx512::InstanceArrayIntersectorKMB<4>::intersect
               (vbool<4>_conflict *valid_i,Precalculations *pre,RayHitK<4> *ray,
               RayQueryContext *context,Primitive_conflict4 *prim)

{
  uint uVar1;
  RTCFormat RVar2;
  InstanceArray *this;
  RTCRayQueryContext *pRVar3;
  RawBufferView *pRVar4;
  char *pcVar5;
  RawBufferView *pRVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Accel *pAVar35;
  ulong uVar36;
  byte bVar37;
  undefined8 unaff_RBP;
  byte bVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  uint uVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  uint uVar105;
  float fVar106;
  uint uVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  uint uVar112;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar126;
  float fVar127;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  float fVar128;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined4 uVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 in_ZMM7 [64];
  float fVar232;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar243;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar241;
  float fVar242;
  undefined1 in_ZMM8 [64];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 in_ZMM10 [64];
  float fVar271;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar282;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  float fVar280;
  float fVar281;
  undefined1 in_ZMM11 [64];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 in_ZMM12 [64];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 in_ZMM13 [64];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 in_ZMM14 [64];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 in_ZMM15 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar306 [16];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 auVar307 [16];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM24 [64];
  undefined1 in_ZMM25 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 in_ZMM27 [64];
  undefined1 auVar315 [16];
  undefined1 in_ZMM28 [64];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 in_ZMM29 [64];
  undefined1 auVar318 [16];
  undefined1 in_ZMM30 [64];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 in_ZMM31 [64];
  RayQueryContext newcontext;
  vint<4> mask;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  RTCIntersectArguments *local_b8;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  ulong uVar38;
  undefined1 auVar83 [16];
  
  bVar37 = valid_i->v;
  this = (InstanceArray *)(context->scene->geometries).items[prim->instID_].ptr;
  pAVar35 = InstanceArray::getObject(this,(ulong)prim->primID_);
  auVar49 = in_ZMM10._0_16_;
  auVar61 = in_ZMM9._0_16_;
  auVar67 = in_ZMM8._0_16_;
  auVar70 = in_ZMM19._0_16_;
  auVar65 = in_ZMM21._0_16_;
  auVar50 = in_ZMM20._0_16_;
  auVar68 = in_ZMM18._0_16_;
  auVar71 = in_ZMM6._0_16_;
  auVar62 = in_ZMM15._0_16_;
  auVar66 = in_ZMM7._0_16_;
  if (pAVar35 != (Accel *)0x0) {
    uVar43 = (this->super_Geometry).mask;
    auVar48._4_4_ = uVar43;
    auVar48._0_4_ = uVar43;
    auVar48._8_4_ = uVar43;
    auVar48._12_4_ = uVar43;
    uVar14 = vptestmd_avx512vl(auVar48,*(undefined1 (*) [16])(ray + 0x90));
    bVar37 = bVar37 & (byte)uVar14 & 0xf;
    uVar38 = CONCAT71((int7)((ulong)unaff_RBP >> 8),bVar37);
    if ((bVar37 != 0) && (pRVar3 = context->user, pRVar3->instID[0] == 0xffffffff)) {
      auVar69._8_8_ = 0;
      auVar69._0_4_ = prim->primID_;
      auVar69._4_4_ = prim->instID_;
      auVar48 = vprolq_avx512vl(auVar69,0x20);
      *pRVar3 = auVar48._0_8_;
      uVar36 = (ulong)prim->primID_;
      if ((this->super_Geometry).field_8.field_0x1 == '\x01') {
        fVar117 = (this->super_Geometry).time_range.lower;
        auVar67._4_4_ = fVar117;
        auVar67._0_4_ = fVar117;
        auVar67._8_4_ = fVar117;
        auVar67._12_4_ = fVar117;
        fVar126 = (this->super_Geometry).fnumTimeSegments;
        auVar66 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar67);
        fVar117 = (this->super_Geometry).time_range.upper - fVar117;
        auVar61._4_4_ = fVar117;
        auVar61._0_4_ = fVar117;
        auVar61._8_4_ = fVar117;
        auVar61._12_4_ = fVar117;
        auVar66 = vdivps_avx(auVar66,auVar61);
        auVar53._0_4_ = fVar126 * auVar66._0_4_;
        auVar53._4_4_ = fVar126 * auVar66._4_4_;
        auVar53._8_4_ = fVar126 * auVar66._8_4_;
        auVar53._12_4_ = fVar126 * auVar66._12_4_;
        auVar67 = vroundps_avx(auVar53,1);
        fVar126 = fVar126 + -1.0;
        auVar66._4_4_ = fVar126;
        auVar66._0_4_ = fVar126;
        auVar66._8_4_ = fVar126;
        auVar66._12_4_ = fVar126;
        auVar67 = vminps_avx(auVar67,auVar66);
        auVar62._12_4_ = 0;
        auVar62._0_12_ = ZEXT812(0);
        auVar62 = auVar62 << 0x20;
        auVar67 = vmaxps_avx(auVar67,auVar62);
        auVar61 = vsubps_avx(auVar53,auVar67);
        local_c8 = vcvtps2dq_avx(auVar67);
        uVar43 = 0;
        for (uVar105 = (uint)bVar37; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x80000000) {
          uVar43 = uVar43 + 1;
        }
        auVar67 = vpbroadcastd_avx512vl();
        uVar14 = vpcmpeqd_avx512vl(local_c8,auVar67);
        fVar117 = auVar61._0_4_;
        fVar126 = auVar61._4_4_;
        fVar127 = auVar61._8_4_;
        fVar128 = auVar61._12_4_;
        if ((byte)(bVar37 ^ 0xf | (byte)uVar14 & 0xf) == 0xf) {
          pRVar4 = (this->l2w_buf).items;
          pRVar6 = pRVar4 + *(int *)(local_c8 + (ulong)uVar43 * 4);
          RVar2 = pRVar4[*(int *)(local_c8 + (ulong)uVar43 * 4)].format;
          if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
            pcVar5 = pRVar6->ptr_ofs;
            lVar40 = pRVar6->stride * uVar36;
            auVar66 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40)),
                                    ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x10)),0x1c);
            auVar67 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x20)),0x28);
            auVar66 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 4)),
                                    ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x14)),0x1c);
            auVar66 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x24)),0x28);
            auVar62 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 8)),
                                    ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)),0x1c);
            auVar71 = vinsertps_avx(auVar62,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x28)),0x28);
            auVar62 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),
                                    ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x1c)),0x1c);
            auVar49 = vinsertps_avx(auVar62,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x2c)),0x28);
          }
          else if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
            pcVar5 = pRVar6->ptr_ofs;
            lVar40 = pRVar6->stride * uVar36;
            auVar167._8_8_ = 0;
            auVar167._0_8_ = *(ulong *)(pcVar5 + lVar40 + 4);
            auVar205._8_8_ = 0;
            auVar205._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x10);
            auVar67 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40)),_DAT_01fbb140,auVar167)
            ;
            auVar66 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),_DAT_01fbb140,
                                         auVar205);
            auVar168._8_8_ = 0;
            auVar168._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x1c);
            auVar71 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)),_DAT_01fbb140,
                                         auVar168);
            auVar169._8_8_ = 0;
            auVar169._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x28);
            auVar49 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x24)),_DAT_01fbb140,
                                         auVar169);
          }
          else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar5 = pRVar6->ptr_ofs;
            lVar40 = pRVar6->stride * uVar36;
            auVar131._8_8_ = 0;
            auVar131._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x10);
            auVar66 = vinsertps_avx(auVar131,ZEXT416(*(uint *)(pcVar5 + lVar40 + 8)),0x20);
            auVar132._8_8_ = 0;
            auVar132._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x34);
            auVar62 = vpermt2ps_avx512vl(auVar132,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar5 + lVar40)))
            ;
            auVar218._8_8_ = 0;
            auVar218._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x1c);
            fVar44 = *(float *)(pcVar5 + lVar40 + 0x24);
            fVar45 = *(float *)(pcVar5 + lVar40 + 0x28);
            fVar46 = *(float *)(pcVar5 + lVar40 + 0x2c);
            auVar71 = vpermt2ps_avx512vl(auVar218,_DAT_01fbb150,
                                         ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)));
            fVar47 = *(float *)(pcVar5 + lVar40 + 0x30);
            auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar45 * fVar45)),ZEXT416((uint)fVar44),
                                      ZEXT416((uint)fVar44));
            auVar67 = vfmadd231ss_fma(auVar67,ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
            auVar67 = vfmadd231ss_fma(auVar67,ZEXT416((uint)fVar47),ZEXT416((uint)fVar47));
            auVar49 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar67._0_4_));
            fVar232 = auVar49._0_4_;
            fVar232 = fVar232 * 1.5 + fVar232 * fVar232 * fVar232 * auVar67._0_4_ * -0.5;
            auVar49 = vinsertps_avx(auVar71,ZEXT416((uint)(fVar44 * fVar232)),0x30);
            auVar67 = vinsertps_avx(auVar62,ZEXT416((uint)(fVar45 * fVar232)),0x30);
            auVar71 = vinsertps_avx(auVar66,ZEXT416((uint)(fVar47 * fVar232)),0x30);
            auVar66 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),
                                    ZEXT416(*(uint *)(pcVar5 + lVar40 + 4)),0x10);
            auVar66 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x3c)),0x20);
            auVar66 = vinsertps_avx(auVar66,ZEXT416((uint)(fVar46 * fVar232)),0x30);
          }
          else if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
            pcVar5 = pRVar6->ptr_ofs;
            lVar40 = pRVar6->stride * uVar36;
            auVar67 = *(undefined1 (*) [16])(pcVar5 + lVar40);
            auVar66 = *(undefined1 (*) [16])(pcVar5 + lVar40 + 0x10);
            auVar71 = *(undefined1 (*) [16])(pcVar5 + lVar40 + 0x20);
            auVar49 = *(undefined1 (*) [16])(pcVar5 + lVar40 + 0x30);
          }
          local_188._4_4_ = auVar67._0_4_;
          auVar62 = vshufps_avx(auVar67,auVar67,0x55);
          auVar48 = vshufps_avx(auVar67,auVar67,0xaa);
          auVar67 = vshufps_avx(auVar67,auVar67,0xff);
          local_168._4_4_ = auVar66._0_4_;
          auVar69 = vshufps_avx(auVar66,auVar66,0x55);
          auVar53 = vshufps_avx(auVar66,auVar66,0xaa);
          auVar66 = vshufps_avx(auVar66,auVar66,0xff);
          local_178._4_4_ = auVar71._0_4_;
          auVar54 = vshufps_avx(auVar71,auVar71,0x55);
          auVar55 = vshufps_avx(auVar71,auVar71,0xaa);
          auVar57 = vshufps_avx512vl(auVar71,auVar71,0xff);
          local_158._4_4_ = auVar49._0_4_;
          auVar71 = vshufps_avx(auVar49,auVar49,0x55);
          auVar56 = vshufps_avx(auVar49,auVar49,0xaa);
          auVar49 = vshufps_avx512vl(auVar49,auVar49,0xff);
          RVar2 = pRVar6[1].format;
          local_158._0_4_ = local_158._4_4_;
          local_158._8_4_ = local_158._4_4_;
          local_158._12_4_ = local_158._4_4_;
          local_188._0_4_ = local_188._4_4_;
          local_188._8_4_ = local_188._4_4_;
          local_188._12_4_ = local_188._4_4_;
          local_168._0_4_ = local_168._4_4_;
          local_168._8_4_ = local_168._4_4_;
          local_168._12_4_ = local_168._4_4_;
          local_178._0_4_ = local_178._4_4_;
          local_178._8_4_ = local_178._4_4_;
          local_178._12_4_ = local_178._4_4_;
          if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
            pcVar5 = pRVar6[1].ptr_ofs;
            lVar40 = uVar36 * pRVar6[1].stride;
            auVar68 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40)),
                                    ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x10)),0x1c);
            auVar68 = vinsertps_avx512f(auVar68,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x20)),0x28);
            auVar50 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 4)),
                                    ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x14)),0x1c);
            auVar50 = vinsertps_avx512f(auVar50,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x24)),0x28);
            auVar65 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar40 + 8)),
                                        ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)),0x1c);
            auVar65 = vinsertps_avx512f(auVar65,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x28)),0x28);
            auVar70 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),
                                        ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x1c)),0x1c);
            auVar70 = vinsertps_avx512f(auVar70,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x2c)),0x28);
          }
          else if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
            pcVar5 = pRVar6[1].ptr_ofs;
            lVar40 = uVar36 * pRVar6[1].stride;
            auVar258._8_8_ = 0;
            auVar258._0_8_ = *(ulong *)(pcVar5 + lVar40 + 4);
            auVar68 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40)),_DAT_01fbb140,auVar258)
            ;
            auVar306._8_8_ = 0;
            auVar306._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x10);
            auVar50 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),_DAT_01fbb140,
                                         auVar306);
            auVar259._8_8_ = 0;
            auVar259._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x1c);
            auVar65 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)),_DAT_01fbb140,
                                         auVar259);
            auVar260._8_8_ = 0;
            auVar260._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x28);
            auVar70 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x24)),_DAT_01fbb140,
                                         auVar260);
          }
          else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar5 = pRVar6[1].ptr_ofs;
            lVar40 = uVar36 * pRVar6[1].stride;
            auVar261._8_8_ = 0;
            auVar261._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x10);
            auVar50 = vinsertps_avx(auVar261,ZEXT416(*(uint *)(pcVar5 + lVar40 + 8)),0x20);
            auVar295._8_8_ = 0;
            auVar295._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x34);
            auVar68 = vpermt2ps_avx512vl(auVar295,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar5 + lVar40)))
            ;
            uVar43 = *(uint *)(pcVar5 + lVar40 + 0x18);
            uVar105 = *(uint *)(pcVar5 + lVar40 + 0x24);
            uVar107 = *(uint *)(pcVar5 + lVar40 + 0x28);
            uVar112 = *(uint *)(pcVar5 + lVar40 + 0x2c);
            auVar307._8_8_ = 0;
            auVar307._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x1c);
            auVar65 = vpermt2ps_avx512vl(auVar307,_DAT_01fbb150,ZEXT416(uVar43));
            uVar1 = *(uint *)(pcVar5 + lVar40 + 0x30);
            auVar70 = vmulss_avx512f(ZEXT416(uVar107),ZEXT416(uVar107));
            auVar70 = vfmadd231ss_avx512f(auVar70,ZEXT416(uVar105),ZEXT416(uVar105));
            auVar70 = vfmadd231ss_avx512f(auVar70,ZEXT416(uVar112),ZEXT416(uVar112));
            auVar70 = vfmadd231ss_avx512f(auVar70,ZEXT416(uVar1),ZEXT416(uVar1));
            auVar58 = vxorps_avx512vl(ZEXT416(uVar43),ZEXT416(uVar43));
            auVar77._4_12_ = auVar58._4_12_;
            auVar77._0_4_ = auVar70._0_4_;
            auVar58 = vrsqrt14ss_avx512f(auVar58,auVar77);
            auVar59 = vmulss_avx512f(auVar58,ZEXT416(0x3fc00000));
            auVar70 = vmulss_avx512f(auVar70,ZEXT416(0xbf000000));
            auVar70 = vmulss_avx512f(auVar58,auVar70);
            auVar58 = vmulss_avx512f(auVar58,auVar58);
            auVar70 = vmulss_avx512f(auVar58,auVar70);
            auVar58 = vaddss_avx512f(auVar59,auVar70);
            auVar70 = vmulss_avx512f(ZEXT416(uVar105),auVar58);
            auVar70 = vinsertps_avx512f(auVar65,auVar70,0x30);
            auVar65 = vmulss_avx512f(ZEXT416(uVar107),auVar58);
            auVar68 = vinsertps_avx512f(auVar68,auVar65,0x30);
            auVar59 = vmulss_avx512f(ZEXT416(uVar112),auVar58);
            auVar65 = vmulss_avx512f(ZEXT416(uVar1),auVar58);
            auVar65 = vinsertps_avx512f(auVar50,auVar65,0x30);
            auVar50 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),
                                        ZEXT416(*(uint *)(pcVar5 + lVar40 + 4)),0x10);
            auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x3c)),0x20);
            auVar50 = vinsertps_avx512f(auVar50,auVar59,0x30);
          }
          else if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
            pcVar5 = pRVar6[1].ptr_ofs;
            lVar40 = uVar36 * pRVar6[1].stride;
            auVar68 = *(undefined1 (*) [16])(pcVar5 + lVar40);
            auVar50 = *(undefined1 (*) [16])(pcVar5 + lVar40 + 0x10);
            auVar65 = *(undefined1 (*) [16])(pcVar5 + lVar40 + 0x20);
            auVar70 = *(undefined1 (*) [16])(pcVar5 + lVar40 + 0x30);
          }
          auVar59 = vshufps_avx512vl(auVar68,auVar68,0xff);
          auVar60 = vshufps_avx512vl(auVar50,auVar50,0xff);
          auVar63 = vshufps_avx512vl(auVar65,auVar65,0xff);
          auVar64 = vshufps_avx512vl(auVar70,auVar70,0xff);
          auVar58 = vmulps_avx512vl(auVar49,auVar64);
          auVar78 = vmulps_avx512vl(auVar67,auVar59);
          auVar79 = vmulps_avx512vl(auVar66,auVar60);
          auVar80 = vmulps_avx512vl(auVar57,auVar63);
          auVar262._0_4_ = auVar80._0_4_ + auVar79._0_4_ + auVar78._0_4_ + auVar58._0_4_;
          auVar262._4_4_ = auVar80._4_4_ + auVar79._4_4_ + auVar78._4_4_ + auVar58._4_4_;
          auVar262._8_4_ = auVar80._8_4_ + auVar79._8_4_ + auVar78._8_4_ + auVar58._8_4_;
          auVar262._12_4_ = auVar80._12_4_ + auVar79._12_4_ + auVar78._12_4_ + auVar58._12_4_;
          auVar78 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar58 = vxorps_avx512vl(auVar262,auVar78);
          uVar36 = vcmpps_avx512vl(auVar262,auVar58,1);
          auVar100 = ZEXT816(0) << 0x20;
          auVar79 = vmaxps_avx512vl(auVar58,auVar262);
          auVar15._8_4_ = 0x7fffffff;
          auVar15._0_8_ = 0x7fffffff7fffffff;
          auVar15._12_4_ = 0x7fffffff;
          auVar58 = vandps_avx512vl(auVar262,auVar15);
          auVar80 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          uVar41 = vcmpps_avx512vl(auVar79,auVar100,1);
          uVar42 = vcmpps_avx512vl(auVar58,auVar80,6);
          auVar16._8_4_ = 0xbb8d3753;
          auVar16._0_8_ = 0xbb8d3753bb8d3753;
          auVar16._12_4_ = 0xbb8d3753;
          auVar81 = vmulps_avx512vl(auVar58,auVar16);
          auVar17._8_4_ = 0x3c9df1b8;
          auVar17._0_8_ = 0x3c9df1b83c9df1b8;
          auVar17._12_4_ = 0x3c9df1b8;
          auVar81 = vaddps_avx512vl(auVar81,auVar17);
          auVar81 = vmulps_avx512vl(auVar58,auVar81);
          auVar18._8_4_ = 0xbd37e81c;
          auVar18._0_8_ = 0xbd37e81cbd37e81c;
          auVar18._12_4_ = 0xbd37e81c;
          auVar81 = vaddps_avx512vl(auVar81,auVar18);
          auVar81 = vmulps_avx512vl(auVar58,auVar81);
          auVar19._8_4_ = 0x3db3edac;
          auVar19._0_8_ = 0x3db3edac3db3edac;
          auVar19._12_4_ = 0x3db3edac;
          auVar81 = vaddps_avx512vl(auVar81,auVar19);
          auVar81 = vmulps_avx512vl(auVar58,auVar81);
          auVar20._8_4_ = 0xbe5ba881;
          auVar20._0_8_ = 0xbe5ba881be5ba881;
          auVar20._12_4_ = 0xbe5ba881;
          auVar81 = vaddps_avx512vl(auVar81,auVar20);
          auVar81 = vmulps_avx512vl(auVar58,auVar81);
          auVar21._8_4_ = 0x3fc90fd1;
          auVar21._0_8_ = 0x3fc90fd13fc90fd1;
          auVar21._12_4_ = 0x3fc90fd1;
          auVar81 = vaddps_avx512vl(auVar81,auVar21);
          auVar58 = vsubps_avx512vl(auVar80,auVar58);
          auVar58 = vsqrtps_avx(auVar58);
          auVar58 = vmulps_avx512vl(auVar58,auVar81);
          auVar81 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
          auVar58 = vsubps_avx512vl(auVar81,auVar58);
          auVar58 = vmaxps_avx(auVar100,auVar58);
          auVar82 = vxorps_avx512vl(auVar58,auVar78);
          bVar7 = (bool)((byte)uVar41 & 1);
          auVar83._0_4_ = (uint)bVar7 * auVar82._0_4_ | (uint)!bVar7 * auVar58._0_4_;
          bVar7 = (bool)((byte)(uVar41 >> 1) & 1);
          auVar83._4_4_ = (uint)bVar7 * auVar82._4_4_ | (uint)!bVar7 * auVar58._4_4_;
          bVar7 = (bool)((byte)(uVar41 >> 2) & 1);
          auVar83._8_4_ = (uint)bVar7 * auVar82._8_4_ | (uint)!bVar7 * auVar58._8_4_;
          bVar7 = (bool)((byte)(uVar41 >> 3) & 1);
          auVar83._12_4_ = (uint)bVar7 * auVar82._12_4_ | (uint)!bVar7 * auVar58._12_4_;
          auVar58 = vsubps_avx512vl(auVar81,auVar83);
          auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fc00000));
          bVar7 = (bool)((byte)uVar42 & 1);
          bVar8 = (bool)((byte)(uVar42 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar42 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar42 >> 3) & 1);
          auVar263._0_4_ =
               (float)((uint)bVar7 * auVar82._0_4_ | (uint)!bVar7 * auVar58._0_4_) * fVar117;
          auVar263._4_4_ =
               (float)((uint)bVar8 * auVar82._4_4_ | (uint)!bVar8 * auVar58._4_4_) * fVar126;
          auVar263._8_4_ =
               (float)((uint)bVar9 * auVar82._8_4_ | (uint)!bVar9 * auVar58._8_4_) * fVar127;
          auVar263._12_4_ =
               (float)((uint)bVar10 * auVar82._12_4_ | (uint)!bVar10 * auVar58._12_4_) * fVar128;
          auVar22._8_4_ = 0x3f22f983;
          auVar22._0_8_ = 0x3f22f9833f22f983;
          auVar22._12_4_ = 0x3f22f983;
          auVar58 = vmulps_avx512vl(auVar263,auVar22);
          auVar58 = vrndscaleps_avx512vl(auVar58,1);
          auVar81 = vmulps_avx512vl(auVar58,auVar81);
          auVar58 = vcvtps2dq_avx512vl(auVar58);
          auVar81 = vsubps_avx512vl(auVar263,auVar81);
          auVar82 = vmulps_avx512vl(auVar81,auVar81);
          auVar23._8_4_ = 0xb2d70013;
          auVar23._0_8_ = 0xb2d70013b2d70013;
          auVar23._12_4_ = 0xb2d70013;
          auVar84 = vmulps_avx512vl(auVar82,auVar23);
          auVar24._8_4_ = 0x363938a8;
          auVar24._0_8_ = 0x363938a8363938a8;
          auVar24._12_4_ = 0x363938a8;
          auVar84 = vaddps_avx512vl(auVar84,auVar24);
          auVar25._8_4_ = 3;
          auVar25._0_8_ = 0x300000003;
          auVar25._12_4_ = 3;
          auVar85 = vpandd_avx512vl(auVar58,auVar25);
          auVar285._8_4_ = 1;
          auVar285._0_8_ = 0x100000001;
          auVar285._12_4_ = 1;
          auVar26._8_4_ = 0xb48b634d;
          auVar26._0_8_ = 0xb48b634db48b634d;
          auVar26._12_4_ = 0xb48b634d;
          auVar86 = vmulps_avx512vl(auVar82,auVar26);
          uVar42 = vptestnmd_avx512vl(auVar58,auVar285);
          uVar42 = uVar42 & 0xf;
          auVar27._8_4_ = 0x37cfab9c;
          auVar27._0_8_ = 0x37cfab9c37cfab9c;
          auVar27._12_4_ = 0x37cfab9c;
          auVar58 = vaddps_avx512vl(auVar86,auVar27);
          auVar84 = vmulps_avx512vl(auVar82,auVar84);
          auVar28._8_4_ = 0xb9501096;
          auVar28._0_8_ = 0xb9501096b9501096;
          auVar28._12_4_ = 0xb9501096;
          auVar84 = vaddps_avx512vl(auVar84,auVar28);
          auVar58 = vmulps_avx512vl(auVar82,auVar58);
          auVar29._8_4_ = 0xbab60981;
          auVar29._0_8_ = 0xbab60981bab60981;
          auVar29._12_4_ = 0xbab60981;
          auVar58 = vaddps_avx512vl(auVar58,auVar29);
          auVar84 = vmulps_avx512vl(auVar82,auVar84);
          auVar30._8_4_ = 0x3c088898;
          auVar30._0_8_ = 0x3c0888983c088898;
          auVar30._12_4_ = 0x3c088898;
          auVar84 = vaddps_avx512vl(auVar84,auVar30);
          auVar58 = vmulps_avx512vl(auVar82,auVar58);
          auVar31._8_4_ = 0x3d2aaaa4;
          auVar31._0_8_ = 0x3d2aaaa43d2aaaa4;
          auVar31._12_4_ = 0x3d2aaaa4;
          auVar58 = vaddps_avx512vl(auVar58,auVar31);
          auVar84 = vmulps_avx512vl(auVar82,auVar84);
          auVar32._8_4_ = 0xbe2aaaab;
          auVar32._0_8_ = 0xbe2aaaabbe2aaaab;
          auVar32._12_4_ = 0xbe2aaaab;
          auVar84 = vaddps_avx512vl(auVar84,auVar32);
          uVar41 = vpcmpgtd_avx512vl(auVar85,auVar285);
          uVar41 = uVar41 & 0xf;
          auVar58 = vmulps_avx512vl(auVar82,auVar58);
          auVar150._0_4_ = auVar58._0_4_ + -0.5;
          auVar150._4_4_ = auVar58._4_4_ + -0.5;
          auVar150._8_4_ = auVar58._8_4_ + -0.5;
          auVar150._12_4_ = auVar58._12_4_ + -0.5;
          auVar58 = vmulps_avx512vl(auVar82,auVar84);
          auVar82 = vmulps_avx512vl(auVar82,auVar150);
          auVar58 = vaddps_avx512vl(auVar58,auVar80);
          auVar58 = vmulps_avx512vl(auVar81,auVar58);
          auVar82 = vaddps_avx512vl(auVar82,auVar80);
          auVar84 = vblendmps_avx512vl(auVar82,auVar58);
          bVar7 = (bool)((byte)uVar42 & 1);
          auVar87._0_4_ = (uint)bVar7 * auVar84._0_4_ | (uint)!bVar7 * auVar81._0_4_;
          bVar7 = (bool)((byte)(uVar42 >> 1) & 1);
          auVar87._4_4_ = (uint)bVar7 * auVar84._4_4_ | (uint)!bVar7 * auVar81._4_4_;
          bVar7 = (bool)((byte)(uVar42 >> 2) & 1);
          auVar87._8_4_ = (uint)bVar7 * auVar84._8_4_ | (uint)!bVar7 * auVar81._8_4_;
          bVar7 = SUB81(uVar42 >> 3,0);
          auVar87._12_4_ = (uint)bVar7 * auVar84._12_4_ | (uint)!bVar7 * auVar81._12_4_;
          bVar7 = (bool)((byte)uVar42 & 1);
          auVar88._0_4_ = (uint)bVar7 * auVar82._0_4_ | (uint)!bVar7 * auVar58._0_4_;
          bVar7 = (bool)((byte)(uVar42 >> 1) & 1);
          auVar88._4_4_ = (uint)bVar7 * auVar82._4_4_ | (uint)!bVar7 * auVar58._4_4_;
          bVar7 = (bool)((byte)(uVar42 >> 2) & 1);
          auVar88._8_4_ = (uint)bVar7 * auVar82._8_4_ | (uint)!bVar7 * auVar58._8_4_;
          bVar7 = SUB81(uVar42 >> 3,0);
          auVar88._12_4_ = (uint)bVar7 * auVar82._12_4_ | (uint)!bVar7 * auVar58._12_4_;
          auVar58 = vpcmpeqd_avx(auVar82,auVar82);
          auVar58 = vpaddd_avx(auVar85,auVar58);
          auVar33._8_4_ = 2;
          auVar33._0_8_ = 0x200000002;
          auVar33._12_4_ = 2;
          uVar42 = vpcmpud_avx512vl(auVar58,auVar33,1);
          uVar42 = uVar42 & 0xf;
          auVar58 = vxorps_avx512vl(auVar64,auVar78);
          bVar37 = (byte)uVar36;
          auVar89._0_4_ =
               (uint)(bVar37 & 1) * auVar58._0_4_ | (uint)!(bool)(bVar37 & 1) * auVar64._0_4_;
          bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
          auVar89._4_4_ = (uint)bVar7 * auVar58._4_4_ | (uint)!bVar7 * auVar64._4_4_;
          bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
          auVar89._8_4_ = (uint)bVar7 * auVar58._8_4_ | (uint)!bVar7 * auVar64._8_4_;
          bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
          auVar89._12_4_ = (uint)bVar7 * auVar58._12_4_ | (uint)!bVar7 * auVar64._12_4_;
          auVar58 = vxorps_avx512vl(auVar59,auVar78);
          auVar90._0_4_ =
               (uint)(bVar37 & 1) * auVar58._0_4_ | (uint)!(bool)(bVar37 & 1) * auVar59._0_4_;
          bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
          auVar90._4_4_ = (uint)bVar7 * auVar58._4_4_ | (uint)!bVar7 * auVar59._4_4_;
          bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
          auVar90._8_4_ = (uint)bVar7 * auVar58._8_4_ | (uint)!bVar7 * auVar59._8_4_;
          bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
          auVar90._12_4_ = (uint)bVar7 * auVar58._12_4_ | (uint)!bVar7 * auVar59._12_4_;
          auVar59 = vfmsub213ps_avx512vl(auVar49,auVar79,auVar89);
          auVar64 = vfmsub213ps_avx512vl(auVar67,auVar79,auVar90);
          auVar58 = vmulps_avx512vl(auVar59,auVar59);
          auVar81 = vmulps_avx512vl(auVar64,auVar64);
          auVar58 = vaddps_avx512vl(auVar58,auVar81);
          auVar81 = vxorps_avx512vl(auVar60,auVar78);
          auVar91._0_4_ =
               (uint)(bVar37 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar37 & 1) * auVar60._0_4_;
          bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
          auVar91._4_4_ = (uint)bVar7 * auVar81._4_4_ | (uint)!bVar7 * auVar60._4_4_;
          bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
          auVar91._8_4_ = (uint)bVar7 * auVar81._8_4_ | (uint)!bVar7 * auVar60._8_4_;
          bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
          auVar91._12_4_ = (uint)bVar7 * auVar81._12_4_ | (uint)!bVar7 * auVar60._12_4_;
          auVar60 = vfmsub213ps_avx512vl(auVar66,auVar79,auVar91);
          auVar81 = vmulps_avx512vl(auVar60,auVar60);
          auVar58 = vaddps_avx512vl(auVar81,auVar58);
          auVar81 = vxorps_avx512vl(auVar63,auVar78);
          auVar92._0_4_ =
               (uint)(bVar37 & 1) * auVar81._0_4_ | (uint)!(bool)(bVar37 & 1) * auVar63._0_4_;
          bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
          auVar92._4_4_ = (uint)bVar7 * auVar81._4_4_ | (uint)!bVar7 * auVar63._4_4_;
          bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
          auVar92._8_4_ = (uint)bVar7 * auVar81._8_4_ | (uint)!bVar7 * auVar63._8_4_;
          bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
          auVar92._12_4_ = (uint)bVar7 * auVar81._12_4_ | (uint)!bVar7 * auVar63._12_4_;
          auVar63 = vfmsub213ps_avx512vl(auVar57,auVar79,auVar92);
          auVar81 = vmulps_avx512vl(auVar63,auVar63);
          auVar170._0_4_ = auVar81._0_4_ + auVar58._0_4_;
          auVar170._4_4_ = auVar81._4_4_ + auVar58._4_4_;
          auVar170._8_4_ = auVar81._8_4_ + auVar58._8_4_;
          auVar170._12_4_ = auVar81._12_4_ + auVar58._12_4_;
          auVar58 = vrsqrt14ps_avx512vl(auVar170);
          fVar44 = auVar58._0_4_;
          fVar45 = auVar58._4_4_;
          fVar46 = auVar58._8_4_;
          fVar47 = auVar58._12_4_;
          auVar171._0_4_ = fVar44 * fVar44 * fVar44 * auVar170._0_4_ * -0.5;
          auVar171._4_4_ = fVar45 * fVar45 * fVar45 * auVar170._4_4_ * -0.5;
          auVar171._8_4_ = fVar46 * fVar46 * fVar46 * auVar170._8_4_ * -0.5;
          auVar171._12_4_ = fVar47 * fVar47 * fVar47 * auVar170._12_4_ * -0.5;
          auVar206._8_4_ = 0x3fc00000;
          auVar206._0_8_ = 0x3fc000003fc00000;
          auVar206._12_4_ = 0x3fc00000;
          auVar58 = vfmadd231ps_fma(auVar171,auVar206,auVar58);
          auVar151._0_4_ = auVar59._0_4_ * auVar58._0_4_;
          auVar151._4_4_ = auVar59._4_4_ * auVar58._4_4_;
          auVar151._8_4_ = auVar59._8_4_ * auVar58._8_4_;
          auVar151._12_4_ = auVar59._12_4_ * auVar58._12_4_;
          auVar184._0_4_ = auVar64._0_4_ * auVar58._0_4_;
          auVar184._4_4_ = auVar64._4_4_ * auVar58._4_4_;
          auVar184._8_4_ = auVar64._8_4_ * auVar58._8_4_;
          auVar184._12_4_ = auVar64._12_4_ * auVar58._12_4_;
          auVar59 = vmulps_avx512vl(auVar60,auVar58);
          auVar58 = vmulps_avx512vl(auVar63,auVar58);
          auVar60 = vxorps_avx512vl(auVar88,auVar78);
          bVar7 = (bool)((byte)uVar42 & 1);
          auVar93._0_4_ = (uint)bVar7 * auVar60._0_4_ | !bVar7 * auVar88._0_4_;
          bVar7 = (bool)((byte)(uVar42 >> 1) & 1);
          auVar93._4_4_ = (uint)bVar7 * auVar60._4_4_ | !bVar7 * auVar88._4_4_;
          bVar7 = (bool)((byte)(uVar42 >> 2) & 1);
          auVar93._8_4_ = (uint)bVar7 * auVar60._8_4_ | !bVar7 * auVar88._8_4_;
          bVar7 = SUB81(uVar42 >> 3,0);
          auVar93._12_4_ = (uint)bVar7 * auVar60._12_4_ | !bVar7 * auVar88._12_4_;
          auVar60 = vxorps_avx512vl(auVar87,auVar78);
          bVar7 = (bool)((byte)uVar41 & 1);
          auVar94._0_4_ = bVar7 * auVar87._0_4_ | (uint)!bVar7 * auVar60._0_4_;
          bVar7 = (bool)((byte)(uVar41 >> 1) & 1);
          auVar94._4_4_ = bVar7 * auVar87._4_4_ | (uint)!bVar7 * auVar60._4_4_;
          bVar7 = (bool)((byte)(uVar41 >> 2) & 1);
          auVar94._8_4_ = bVar7 * auVar87._8_4_ | (uint)!bVar7 * auVar60._8_4_;
          bVar7 = SUB81(uVar41 >> 3,0);
          auVar94._12_4_ = bVar7 * auVar87._12_4_ | (uint)!bVar7 * auVar60._12_4_;
          auVar60 = vmulps_avx512vl(auVar151,auVar94);
          auVar63 = vmulps_avx512vl(auVar184,auVar94);
          auVar59 = vmulps_avx512vl(auVar59,auVar94);
          auVar58 = vmulps_avx512vl(auVar58,auVar94);
          auVar60 = vfmadd231ps_avx512vl(auVar60,auVar93,auVar49);
          auVar63 = vfmadd231ps_avx512vl(auVar63,auVar93,auVar67);
          auVar59 = vfmadd231ps_avx512vl(auVar59,auVar93,auVar66);
          auVar58 = vfmadd231ps_avx512vl(auVar58,auVar57,auVar93);
          auVar64 = vsubps_avx512vl(auVar89,auVar49);
          auVar64 = vfmadd213ps_avx512vl(auVar64,auVar61,auVar49);
          auVar49 = vsubps_avx512vl(auVar90,auVar67);
          auVar67 = vfmadd213ps_fma(auVar49,auVar61,auVar67);
          auVar49 = vsubps_avx512vl(auVar91,auVar66);
          auVar66 = vfmadd213ps_fma(auVar49,auVar61,auVar66);
          auVar49 = vsubps_avx512vl(auVar92,auVar57);
          auVar57 = vfmadd213ps_avx512vl(auVar49,auVar61,auVar57);
          auVar286._0_4_ =
               auVar57._0_4_ * auVar57._0_4_ +
               auVar66._0_4_ * auVar66._0_4_ +
               auVar64._0_4_ * auVar64._0_4_ + auVar67._0_4_ * auVar67._0_4_;
          auVar286._4_4_ =
               auVar57._4_4_ * auVar57._4_4_ +
               auVar66._4_4_ * auVar66._4_4_ +
               auVar64._4_4_ * auVar64._4_4_ + auVar67._4_4_ * auVar67._4_4_;
          auVar286._8_4_ =
               auVar57._8_4_ * auVar57._8_4_ +
               auVar66._8_4_ * auVar66._8_4_ +
               auVar64._8_4_ * auVar64._8_4_ + auVar67._8_4_ * auVar67._8_4_;
          auVar286._12_4_ =
               auVar57._12_4_ * auVar57._12_4_ +
               auVar66._12_4_ * auVar66._12_4_ +
               auVar64._12_4_ * auVar64._12_4_ + auVar67._12_4_ * auVar67._12_4_;
          auVar49 = vrsqrt14ps_avx512vl(auVar286);
          fVar44 = auVar49._0_4_;
          fVar45 = auVar49._4_4_;
          fVar46 = auVar49._8_4_;
          fVar47 = auVar49._12_4_;
          auVar264._0_4_ = fVar44 * fVar44 * fVar44 * auVar286._0_4_ * -0.5;
          auVar264._4_4_ = fVar45 * fVar45 * fVar45 * auVar286._4_4_ * -0.5;
          auVar264._8_4_ = fVar46 * fVar46 * fVar46 * auVar286._8_4_ * -0.5;
          auVar264._12_4_ = fVar47 * fVar47 * fVar47 * auVar286._12_4_ * -0.5;
          auVar49 = vfmadd231ps_fma(auVar264,auVar49,auVar206);
          auVar34._8_4_ = 0x3f7fdf3b;
          auVar34._0_8_ = 0x3f7fdf3b3f7fdf3b;
          auVar34._12_4_ = 0x3f7fdf3b;
          uVar36 = vcmpps_avx512vl(auVar79,auVar34,6);
          auVar78 = vbroadcastss_avx512vl(auVar68);
          auVar64 = vmulps_avx512vl(auVar64,auVar49);
          bVar37 = (byte)uVar36;
          auVar95._0_4_ =
               (uint)(bVar37 & 1) * auVar64._0_4_ | (uint)!(bool)(bVar37 & 1) * auVar60._0_4_;
          bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
          auVar95._4_4_ = (uint)bVar7 * auVar64._4_4_ | (uint)!bVar7 * auVar60._4_4_;
          bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
          auVar95._8_4_ = (uint)bVar7 * auVar64._8_4_ | (uint)!bVar7 * auVar60._8_4_;
          bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
          auVar95._12_4_ = (uint)bVar7 * auVar64._12_4_ | (uint)!bVar7 * auVar60._12_4_;
          auVar60 = vshufps_avx512vl(auVar68,auVar68,0x55);
          auVar68 = vshufps_avx512vl(auVar68,auVar68,0xaa);
          auVar67 = vmulps_avx512vl(auVar67,auVar49);
          auVar96._0_4_ =
               (uint)(bVar37 & 1) * auVar67._0_4_ | (uint)!(bool)(bVar37 & 1) * auVar63._0_4_;
          bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
          auVar96._4_4_ = (uint)bVar7 * auVar67._4_4_ | (uint)!bVar7 * auVar63._4_4_;
          bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
          auVar96._8_4_ = (uint)bVar7 * auVar67._8_4_ | (uint)!bVar7 * auVar63._8_4_;
          bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
          auVar96._12_4_ = (uint)bVar7 * auVar67._12_4_ | (uint)!bVar7 * auVar63._12_4_;
          auVar67 = vbroadcastss_avx512vl(auVar50);
          auVar66 = vmulps_avx512vl(auVar66,auVar49);
          auVar97._0_4_ =
               (uint)(bVar37 & 1) * auVar66._0_4_ | (uint)!(bool)(bVar37 & 1) * auVar59._0_4_;
          bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
          auVar97._4_4_ = (uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * auVar59._4_4_;
          bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
          auVar97._8_4_ = (uint)bVar7 * auVar66._8_4_ | (uint)!bVar7 * auVar59._8_4_;
          bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
          auVar97._12_4_ = (uint)bVar7 * auVar66._12_4_ | (uint)!bVar7 * auVar59._12_4_;
          auVar66 = vshufps_avx512vl(auVar50,auVar50,0x55);
          auVar50 = vshufps_avx512vl(auVar50,auVar50,0xaa);
          auVar49 = vmulps_avx512vl(auVar57,auVar49);
          auVar98._0_4_ =
               (uint)(bVar37 & 1) * auVar49._0_4_ | (uint)!(bool)(bVar37 & 1) * auVar58._0_4_;
          bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
          auVar98._4_4_ = (uint)bVar7 * auVar49._4_4_ | (uint)!bVar7 * auVar58._4_4_;
          bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
          auVar98._8_4_ = (uint)bVar7 * auVar49._8_4_ | (uint)!bVar7 * auVar58._8_4_;
          bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
          auVar98._12_4_ = (uint)bVar7 * auVar49._12_4_ | (uint)!bVar7 * auVar58._12_4_;
          auVar49 = vbroadcastss_avx512vl(auVar65);
          auVar57 = vshufps_avx512vl(auVar65,auVar65,0x55);
          auVar65 = vshufps_avx512vl(auVar65,auVar65,0xaa);
          auVar58 = vsubps_avx512vl(auVar80,auVar61);
          auVar207._0_4_ = fVar117 * auVar78._0_4_;
          auVar207._4_4_ = fVar126 * auVar78._4_4_;
          auVar207._8_4_ = fVar127 * auVar78._8_4_;
          auVar207._12_4_ = fVar128 * auVar78._12_4_;
          auVar59 = vfmadd213ps_avx512vl(local_188,auVar58,auVar207);
          auVar63 = vbroadcastss_avx512vl(auVar70);
          auVar152._0_4_ = fVar117 * auVar60._0_4_;
          auVar152._4_4_ = fVar126 * auVar60._4_4_;
          auVar152._8_4_ = fVar127 * auVar60._8_4_;
          auVar152._12_4_ = fVar128 * auVar60._12_4_;
          auVar62 = vfmadd213ps_avx512vl(auVar62,auVar58,auVar152);
          auVar60 = vshufps_avx512vl(auVar70,auVar70,0x55);
          auVar70 = vshufps_avx512vl(auVar70,auVar70,0xaa);
          auVar287._0_4_ = auVar68._0_4_ * fVar117;
          auVar287._4_4_ = auVar68._4_4_ * fVar126;
          auVar287._8_4_ = auVar68._8_4_ * fVar127;
          auVar287._12_4_ = auVar68._12_4_ * fVar128;
          auVar68 = vfmadd213ps_avx512vl(auVar48,auVar58,auVar287);
          auVar172._0_4_ = fVar117 * auVar67._0_4_;
          auVar172._4_4_ = fVar126 * auVar67._4_4_;
          auVar172._8_4_ = fVar127 * auVar67._8_4_;
          auVar172._12_4_ = fVar128 * auVar67._12_4_;
          auVar185._0_4_ = fVar117 * auVar66._0_4_;
          auVar185._4_4_ = fVar126 * auVar66._4_4_;
          auVar185._8_4_ = fVar127 * auVar66._8_4_;
          auVar185._12_4_ = fVar128 * auVar66._12_4_;
          auVar288._0_4_ = auVar50._0_4_ * fVar117;
          auVar288._4_4_ = auVar50._4_4_ * fVar126;
          auVar288._8_4_ = auVar50._8_4_ * fVar127;
          auVar288._12_4_ = auVar50._12_4_ * fVar128;
          auVar50 = vfmadd213ps_avx512vl(local_168,auVar58,auVar172);
          auVar48 = vfmadd213ps_avx512vl(auVar69,auVar58,auVar185);
          auVar69 = vfmadd213ps_avx512vl(auVar53,auVar58,auVar288);
          auVar173._0_4_ = auVar49._0_4_ * fVar117;
          auVar173._4_4_ = auVar49._4_4_ * fVar126;
          auVar173._8_4_ = auVar49._8_4_ * fVar127;
          auVar173._12_4_ = auVar49._12_4_ * fVar128;
          auVar186._0_4_ = auVar57._0_4_ * fVar117;
          auVar186._4_4_ = auVar57._4_4_ * fVar126;
          auVar186._8_4_ = auVar57._8_4_ * fVar127;
          auVar186._12_4_ = auVar57._12_4_ * fVar128;
          auVar265._0_4_ = auVar65._0_4_ * fVar117;
          auVar265._4_4_ = auVar65._4_4_ * fVar126;
          auVar265._8_4_ = auVar65._8_4_ * fVar127;
          auVar265._12_4_ = auVar65._12_4_ * fVar128;
          auVar49 = vfmadd213ps_avx512vl(local_178,auVar58,auVar173);
          auVar65 = vfmadd213ps_avx512vl(auVar54,auVar58,auVar186);
          auVar53 = vfmadd213ps_avx512vl(auVar55,auVar58,auVar265);
          auVar174._0_4_ = fVar117 * auVar63._0_4_;
          auVar174._4_4_ = fVar126 * auVar63._4_4_;
          auVar174._8_4_ = fVar127 * auVar63._8_4_;
          auVar174._12_4_ = fVar128 * auVar63._12_4_;
          auVar153._0_4_ = fVar117 * auVar60._0_4_;
          auVar153._4_4_ = fVar126 * auVar60._4_4_;
          auVar153._8_4_ = fVar127 * auVar60._8_4_;
          auVar153._12_4_ = fVar128 * auVar60._12_4_;
          auVar66 = vmulps_avx512vl(auVar61,auVar70);
          auVar70 = vfmadd213ps_avx512vl(local_158,auVar58,auVar174);
          auVar61 = vfmadd213ps_avx512vl(auVar71,auVar58,auVar153);
          auVar71 = vfmadd213ps_avx512vl(auVar56,auVar58,auVar66);
          auVar67 = vmulps_avx512vl(auVar95,auVar95);
          auVar54 = vmulps_avx512vl(auVar96,auVar96);
          auVar121._0_4_ = auVar67._0_4_ + auVar54._0_4_;
          auVar121._4_4_ = auVar67._4_4_ + auVar54._4_4_;
          auVar121._8_4_ = auVar67._8_4_ + auVar54._8_4_;
          auVar121._12_4_ = auVar67._12_4_ + auVar54._12_4_;
          auVar55 = vmulps_avx512vl(auVar97,auVar97);
          auVar66 = vsubps_avx(auVar121,auVar55);
          auVar56 = vmulps_avx512vl(auVar98,auVar98);
          auVar57 = vsubps_avx512vl(auVar66,auVar56);
          auVar66 = vmulps_avx512vl(auVar96,auVar97);
          auVar58 = vmulps_avx512vl(auVar95,auVar98);
          fVar117 = auVar66._0_4_ + auVar58._0_4_;
          fVar126 = auVar66._4_4_ + auVar58._4_4_;
          fVar127 = auVar66._8_4_ + auVar58._8_4_;
          fVar128 = auVar66._12_4_ + auVar58._12_4_;
          auVar122._0_4_ = fVar117 + fVar117;
          auVar122._4_4_ = fVar126 + fVar126;
          auVar122._8_4_ = fVar127 + fVar127;
          auVar122._12_4_ = fVar128 + fVar128;
          auVar60 = vmulps_avx512vl(auVar96,auVar98);
          auVar63 = vmulps_avx512vl(auVar95,auVar97);
          auVar64 = vsubps_avx512vl(auVar60,auVar63);
          auVar64 = vaddps_avx512vl(auVar64,auVar64);
          auVar66 = vsubps_avx(auVar66,auVar58);
          auVar266._0_4_ = auVar66._0_4_ + auVar66._0_4_;
          auVar266._4_4_ = auVar66._4_4_ + auVar66._4_4_;
          auVar266._8_4_ = auVar66._8_4_ + auVar66._8_4_;
          auVar266._12_4_ = auVar66._12_4_ + auVar66._12_4_;
          auVar66 = vsubps_avx(auVar67,auVar54);
          auVar175._0_4_ = auVar55._0_4_ + auVar66._0_4_;
          auVar175._4_4_ = auVar55._4_4_ + auVar66._4_4_;
          auVar175._8_4_ = auVar55._8_4_ + auVar66._8_4_;
          auVar175._12_4_ = auVar55._12_4_ + auVar66._12_4_;
          auVar54 = vsubps_avx512vl(auVar175,auVar56);
          auVar67 = vmulps_avx512vl(auVar97,auVar98);
          auVar58 = vmulps_avx512vl(auVar95,auVar96);
          auVar78 = vaddps_avx512vl(auVar67,auVar58);
          auVar79 = vaddps_avx512vl(auVar78,auVar78);
          fVar117 = auVar60._0_4_ + auVar63._0_4_;
          fVar126 = auVar60._4_4_ + auVar63._4_4_;
          fVar127 = auVar60._8_4_ + auVar63._8_4_;
          fVar128 = auVar60._12_4_ + auVar63._12_4_;
          auVar289._0_4_ = fVar117 + fVar117;
          auVar289._4_4_ = fVar126 + fVar126;
          auVar289._8_4_ = fVar127 + fVar127;
          auVar289._12_4_ = fVar128 + fVar128;
          auVar67 = vsubps_avx(auVar67,auVar58);
          auVar67 = vaddps_avx512vl(auVar67,auVar67);
          auVar66 = vsubps_avx(auVar66,auVar55);
          auVar154._0_4_ = auVar56._0_4_ + auVar66._0_4_;
          auVar154._4_4_ = auVar56._4_4_ + auVar66._4_4_;
          auVar154._8_4_ = auVar56._8_4_ + auVar66._8_4_;
          auVar154._12_4_ = auVar56._12_4_ + auVar66._12_4_;
          auVar66 = vmulps_avx512vl(auVar64,auVar100);
          auVar55 = vxorps_avx512vl(auVar78,auVar78);
          auVar55 = vfmadd213ps_avx512vl(auVar55,auVar122,auVar66);
          auVar302._0_4_ = auVar122._0_4_ + auVar66._0_4_;
          auVar302._4_4_ = auVar122._4_4_ + auVar66._4_4_;
          auVar302._8_4_ = auVar122._8_4_ + auVar66._8_4_;
          auVar302._12_4_ = auVar122._12_4_ + auVar66._12_4_;
          auVar66 = vfmadd213ps_avx512vl(auVar122,auVar100,auVar64);
          auVar56 = vfmadd231ps_avx512vl(auVar302,auVar57,auVar100);
          auVar58 = vfmadd231ps_avx512vl(auVar66,auVar100,auVar57);
          auVar66 = vmulps_avx512vl(auVar79,auVar100);
          auVar60 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar54,auVar66);
          auVar66 = vaddps_avx512vl(auVar54,auVar66);
          auVar54 = vfmadd213ps_avx512vl(auVar54,auVar100,auVar79);
          auVar60 = vaddps_avx512vl(auVar266,auVar60);
          auVar63 = vfmadd231ps_avx512vl(auVar66,auVar266,auVar100);
          auVar54 = vfmadd231ps_avx512vl(auVar54,auVar100,auVar266);
          auVar176._0_4_ = auVar154._0_4_ * 0.0;
          auVar176._4_4_ = auVar154._4_4_ * 0.0;
          auVar176._8_4_ = auVar154._8_4_ * 0.0;
          auVar176._12_4_ = auVar154._12_4_ * 0.0;
          auVar66 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar67,auVar176);
          auVar64 = vaddps_avx512vl(auVar67,auVar176);
          auVar67 = vfmadd213ps_avx512vl(auVar67,auVar100,auVar154);
          auVar155._0_4_ = auVar289._0_4_ + auVar66._0_4_;
          auVar155._4_4_ = auVar289._4_4_ + auVar66._4_4_;
          auVar155._8_4_ = auVar289._8_4_ + auVar66._8_4_;
          auVar155._12_4_ = auVar289._12_4_ + auVar66._12_4_;
          auVar66 = vfmadd231ps_fma(auVar64,auVar289,auVar100);
          auVar67 = vfmadd231ps_avx512vl(auVar67,auVar100,auVar289);
          auVar64 = vaddps_avx512vl(auVar62,auVar100);
          auVar68 = vaddps_avx512vl(auVar68,auVar100);
          auVar69 = vaddps_avx512vl(auVar69,auVar100);
          auVar62 = vmulps_avx512vl(auVar155,auVar100);
          fVar117 = auVar66._0_4_;
          auVar274._0_4_ = fVar117 * 0.0;
          fVar126 = auVar66._4_4_;
          auVar274._4_4_ = fVar126 * 0.0;
          fVar127 = auVar66._8_4_;
          auVar274._8_4_ = fVar127 * 0.0;
          fVar128 = auVar66._12_4_;
          auVar274._12_4_ = fVar128 * 0.0;
          auVar66 = vmulps_avx512vl(auVar67,auVar100);
          auVar78 = vfmadd213ps_avx512vl(ZEXT416(0) << 0x20,auVar60,auVar62);
          auVar79 = vfmadd213ps_avx512vl(ZEXT416(0) << 0x20,auVar63,auVar274);
          auVar80 = vfmadd213ps_avx512vl(auVar100,auVar54,auVar66);
          auVar62 = vfmadd231ps_avx512vl(auVar62,auVar48,auVar60);
          auVar81 = vfmadd231ps_avx512vl(auVar274,auVar48,auVar63);
          auVar48 = vfmadd213ps_avx512vl(auVar48,auVar54,auVar66);
          auVar187._0_4_ = auVar53._0_4_ * auVar155._0_4_;
          auVar187._4_4_ = auVar53._4_4_ * auVar155._4_4_;
          auVar187._8_4_ = auVar53._8_4_ * auVar155._8_4_;
          auVar187._12_4_ = auVar53._12_4_ * auVar155._12_4_;
          auVar208._0_4_ = auVar53._0_4_ * fVar117;
          auVar208._4_4_ = auVar53._4_4_ * fVar126;
          auVar208._8_4_ = auVar53._8_4_ * fVar127;
          auVar208._12_4_ = auVar53._12_4_ * fVar128;
          auVar66 = vmulps_avx512vl(auVar53,auVar67);
          auVar53 = vfmadd231ps_avx512vl(auVar187,auVar65,auVar60);
          auVar82 = vfmadd231ps_avx512vl(auVar208,auVar65,auVar63);
          auVar65 = vfmadd231ps_avx512vl(auVar66,auVar54,auVar65);
          auVar156._0_4_ = auVar71._0_4_ * auVar155._0_4_;
          auVar156._4_4_ = auVar71._4_4_ * auVar155._4_4_;
          auVar156._8_4_ = auVar71._8_4_ * auVar155._8_4_;
          auVar156._12_4_ = auVar71._12_4_ * auVar155._12_4_;
          auVar177._0_4_ = auVar71._0_4_ * fVar117;
          auVar177._4_4_ = auVar71._4_4_ * fVar126;
          auVar177._8_4_ = auVar71._8_4_ * fVar127;
          auVar177._12_4_ = auVar71._12_4_ * fVar128;
          auVar66 = vmulps_avx512vl(auVar71,auVar67);
          auVar60 = vfmadd231ps_avx512vl(auVar156,auVar61,auVar60);
          auVar63 = vfmadd231ps_avx512vl(auVar177,auVar61,auVar63);
          auVar54 = vfmadd231ps_avx512vl(auVar66,auVar61,auVar54);
          auVar55 = vaddps_avx512vl(auVar57,auVar55);
          auVar66 = vfmadd231ps_fma(auVar78,auVar59,auVar55);
          auVar67 = vfmadd231ps_fma(auVar79,auVar59,auVar56);
          auVar61 = vfmadd231ps_fma(auVar80,auVar58,auVar59);
          auVar57 = vfmadd231ps_avx512vl(auVar62,auVar50,auVar55);
          auVar59 = vfmadd231ps_avx512vl(auVar81,auVar50,auVar56);
          auVar78 = vfmadd231ps_avx512vl(auVar48,auVar58,auVar50);
          auVar62 = vfmadd231ps_fma(auVar53,auVar49,auVar55);
          auVar71 = vfmadd231ps_fma(auVar82,auVar49,auVar56);
          auVar49 = vfmadd231ps_fma(auVar65,auVar58,auVar49);
          auVar50 = vfmadd231ps_avx512vl(auVar60,auVar70,auVar55);
          auVar55 = vaddps_avx512vl(auVar64,auVar50);
          auVar50 = vfmadd231ps_avx512vl(auVar63,auVar70,auVar56);
          auVar53 = vaddps_avx512vl(auVar68,auVar50);
          auVar68 = vfmadd231ps_avx512vl(auVar54,auVar70,auVar58);
          auVar54 = vaddps_avx512vl(auVar69,auVar68);
          auVar123._0_4_ = auVar71._0_4_ * auVar78._0_4_;
          auVar123._4_4_ = auVar71._4_4_ * auVar78._4_4_;
          auVar123._8_4_ = auVar71._8_4_ * auVar78._8_4_;
          auVar123._12_4_ = auVar71._12_4_ * auVar78._12_4_;
          auVar68 = vfmsub231ps_fma(auVar123,auVar59,auVar49);
          auVar50 = vmulps_avx512vl(auVar49,auVar57);
          auVar50 = vfmsub231ps_fma(auVar50,auVar78,auVar62);
          auVar219._0_4_ = auVar59._0_4_ * auVar62._0_4_;
          auVar219._4_4_ = auVar59._4_4_ * auVar62._4_4_;
          auVar219._8_4_ = auVar59._8_4_ * auVar62._8_4_;
          auVar219._12_4_ = auVar59._12_4_ * auVar62._12_4_;
          auVar56 = vfmsub231ps_avx512vl(auVar219,auVar57,auVar71);
          fVar117 = auVar61._0_4_;
          auVar224._0_4_ = fVar117 * auVar62._0_4_;
          fVar126 = auVar61._4_4_;
          auVar224._4_4_ = fVar126 * auVar62._4_4_;
          fVar127 = auVar61._8_4_;
          auVar224._8_4_ = fVar127 * auVar62._8_4_;
          fVar128 = auVar61._12_4_;
          auVar224._12_4_ = fVar128 * auVar62._12_4_;
          auVar70 = vfmsub231ps_fma(auVar224,auVar66,auVar49);
          auVar157._0_4_ = auVar67._0_4_ * auVar49._0_4_;
          auVar157._4_4_ = auVar67._4_4_ * auVar49._4_4_;
          auVar157._8_4_ = auVar67._8_4_ * auVar49._8_4_;
          auVar157._12_4_ = auVar67._12_4_ * auVar49._12_4_;
          auVar49 = vfmsub231ps_fma(auVar157,auVar71,auVar61);
          auVar233._0_4_ = auVar66._0_4_ * auVar71._0_4_;
          auVar233._4_4_ = auVar66._4_4_ * auVar71._4_4_;
          auVar233._8_4_ = auVar66._8_4_ * auVar71._8_4_;
          auVar233._12_4_ = auVar66._12_4_ * auVar71._12_4_;
          auVar48 = vfmsub231ps_fma(auVar233,auVar67,auVar62);
          auVar188._0_4_ = auVar59._0_4_ * fVar117;
          auVar188._4_4_ = auVar59._4_4_ * fVar126;
          auVar188._8_4_ = auVar59._8_4_ * fVar127;
          auVar188._12_4_ = auVar59._12_4_ * fVar128;
          auVar62 = vfmsub231ps_fma(auVar188,auVar67,auVar78);
          auVar209._0_4_ = auVar66._0_4_ * auVar78._0_4_;
          auVar209._4_4_ = auVar66._4_4_ * auVar78._4_4_;
          auVar209._8_4_ = auVar66._8_4_ * auVar78._8_4_;
          auVar209._12_4_ = auVar66._12_4_ * auVar78._12_4_;
          auVar58 = vfmsub231ps_avx512vl(auVar209,auVar61,auVar57);
          auVar61 = vmulps_avx512vl(auVar57,auVar67);
          auVar69 = vfmsub231ps_fma(auVar61,auVar66,auVar59);
          auVar275._0_4_ = fVar117 * auVar56._0_4_;
          auVar275._4_4_ = fVar126 * auVar56._4_4_;
          auVar275._8_4_ = fVar127 * auVar56._8_4_;
          auVar275._12_4_ = fVar128 * auVar56._12_4_;
          auVar67 = vfmadd231ps_fma(auVar275,auVar50,auVar67);
          auVar65 = vfmadd231ps_fma(auVar67,auVar68,auVar66);
          auVar66 = vdivps_avx(auVar68,auVar65);
          auVar67 = vdivps_avx(auVar49,auVar65);
          auVar61 = vdivps_avx(auVar62,auVar65);
          auVar62 = vdivps_avx(auVar50,auVar65);
          auVar71 = vdivps_avx(auVar70,auVar65);
          auVar49 = vdivps_avx(auVar58,auVar65);
          auVar68 = vdivps_avx(auVar56,auVar65);
          auVar50 = vdivps_avx(auVar48,auVar65);
          auVar65 = vdivps_avx(auVar69,auVar65);
          auVar70 = vmulps_avx512vl(auVar54,auVar68);
          auVar48 = vmulps_avx512vl(auVar54,auVar50);
          auVar69 = vmulps_avx512vl(auVar54,auVar65);
          auVar70 = vfmadd231ps_fma(auVar70,auVar53,auVar62);
          auVar48 = vfmadd231ps_fma(auVar48,auVar53,auVar71);
          auVar53 = vfmadd231ps_fma(auVar69,auVar49,auVar53);
          auVar69 = vfmadd231ps_fma(auVar70,auVar55,auVar66);
          auVar48 = vfmadd231ps_fma(auVar48,auVar55,auVar67);
          auVar70 = vfmadd231ps_fma(auVar53,auVar61,auVar55);
        }
        else {
          pRVar6 = (this->l2w_buf).items;
          uVar41 = uVar38 & 0xffffffff;
          while( true ) {
            bVar37 = (byte)uVar41;
            auVar67 = in_ZMM28._0_16_;
            auVar71 = in_ZMM30._0_16_;
            auVar49 = in_ZMM31._0_16_;
            if (bVar37 == 0) break;
            uVar43 = 0;
            for (uVar105 = (uint)uVar41 & 0xff; (uVar105 & 1) == 0;
                uVar105 = uVar105 >> 1 | 0x80000000) {
              uVar43 = uVar43 + 1;
            }
            pRVar4 = pRVar6 + *(int *)(local_c8 + (ulong)uVar43 * 4);
            RVar2 = pRVar6[*(int *)(local_c8 + (ulong)uVar43 * 4)].format;
            if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar5 = pRVar4->ptr_ofs;
              lVar40 = pRVar4->stride * uVar36;
              auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40)),
                                      ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x10)),0x1c);
              auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x20)),0x28);
              in_ZMM5 = ZEXT1664(auVar67);
              auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 4)),
                                      ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x14)),0x1c);
              auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x24)),0x28);
              in_ZMM7 = ZEXT1664(auVar67);
              auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 8)),
                                      ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)),0x1c);
              auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x28)),0x28);
              in_ZMM8 = ZEXT1664(auVar67);
              auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),
                                      ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x1c)),0x1c);
              auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x2c)),0x28);
              in_ZMM10 = ZEXT1664(auVar67);
            }
            else if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar5 = pRVar4->ptr_ofs;
              lVar40 = pRVar4->stride * uVar36;
              auVar133._8_8_ = 0;
              auVar133._0_8_ = *(ulong *)(pcVar5 + lVar40 + 4);
              auVar234._8_8_ = 0;
              auVar234._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x10);
              auVar67 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40)),_DAT_01fbb140,
                                           auVar133);
              in_ZMM5 = ZEXT1664(auVar67);
              auVar67 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),_DAT_01fbb140,
                                           auVar234);
              in_ZMM7 = ZEXT1664(auVar67);
              auVar134._8_8_ = 0;
              auVar134._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x1c);
              auVar67 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)),_DAT_01fbb140,
                                           auVar134);
              in_ZMM8 = ZEXT1664(auVar67);
              auVar135._8_8_ = 0;
              auVar135._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x28);
              auVar67 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x24)),_DAT_01fbb140,
                                           auVar135);
              in_ZMM10 = ZEXT1664(auVar67);
            }
            else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar5 = pRVar4->ptr_ofs;
              lVar40 = pRVar4->stride * uVar36;
              auVar210._8_8_ = 0;
              auVar210._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x10);
              auVar67 = vinsertps_avx(auVar210,ZEXT416(*(uint *)(pcVar5 + lVar40 + 8)),0x20);
              auVar211._8_8_ = 0;
              auVar211._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x34);
              auVar49 = vpermt2ps_avx512vl(auVar211,_DAT_01fbb150,
                                           ZEXT416(*(uint *)(pcVar5 + lVar40)));
              auVar235._8_8_ = 0;
              auVar235._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x1c);
              auVar71 = vpermt2ps_avx512vl(auVar235,_DAT_01fbb150,
                                           ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)));
              uVar43 = *(uint *)(pcVar5 + lVar40 + 0x24);
              uVar105 = *(uint *)(pcVar5 + lVar40 + 0x28);
              uVar107 = *(uint *)(pcVar5 + lVar40 + 0x2c);
              uVar112 = *(uint *)(pcVar5 + lVar40 + 0x30);
              auVar68 = vmulss_avx512f(ZEXT416(uVar105),ZEXT416(uVar105));
              auVar68 = vfmadd231ss_avx512f(auVar68,ZEXT416(uVar43),ZEXT416(uVar43));
              auVar68 = vfmadd231ss_avx512f(auVar68,ZEXT416(uVar107),ZEXT416(uVar107));
              auVar68 = vfmadd231ss_avx512f(auVar68,ZEXT416(uVar112),ZEXT416(uVar112));
              auVar50 = vrsqrt14ss_avx512f(auVar62,ZEXT416(auVar68._0_4_));
              auVar65 = vmulss_avx512f(auVar50,ZEXT416(0x3fc00000));
              auVar68 = vmulss_avx512f(auVar68,ZEXT416(0xbf000000));
              auVar68 = vmulss_avx512f(auVar50,auVar68);
              auVar50 = vmulss_avx512f(auVar50,auVar50);
              auVar68 = vmulss_avx512f(auVar50,auVar68);
              auVar68 = vaddss_avx512f(auVar65,auVar68);
              auVar50 = vmulss_avx512f(ZEXT416(uVar43),auVar68);
              auVar71 = vinsertps_avx(auVar71,auVar50,0x30);
              in_ZMM10 = ZEXT1664(auVar71);
              auVar71 = vmulss_avx512f(ZEXT416(uVar105),auVar68);
              auVar71 = vinsertps_avx(auVar49,auVar71,0x30);
              in_ZMM5 = ZEXT1664(auVar71);
              auVar71 = vmulss_avx512f(ZEXT416(uVar107),auVar68);
              auVar49 = vmulss_avx512f(ZEXT416(uVar112),auVar68);
              auVar67 = vinsertps_avx(auVar67,auVar49,0x30);
              in_ZMM8 = ZEXT1664(auVar67);
              auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),
                                      ZEXT416(*(uint *)(pcVar5 + lVar40 + 4)),0x10);
              auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x3c)),0x20);
              auVar67 = vinsertps_avx(auVar67,auVar71,0x30);
              in_ZMM7 = ZEXT1664(auVar67);
            }
            else if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar5 = pRVar4->ptr_ofs;
              lVar40 = pRVar4->stride * uVar36;
              in_ZMM5 = ZEXT1664(*(undefined1 (*) [16])(pcVar5 + lVar40));
              in_ZMM7 = ZEXT1664(*(undefined1 (*) [16])(pcVar5 + lVar40 + 0x10));
              in_ZMM8 = ZEXT1664(*(undefined1 (*) [16])(pcVar5 + lVar40 + 0x20));
              in_ZMM10 = ZEXT1664(*(undefined1 (*) [16])(pcVar5 + lVar40 + 0x30));
            }
            auVar67 = vpbroadcastd_avx512vl();
            uVar14 = vpcmpeqd_avx512vl(auVar67,local_c8);
            RVar2 = pRVar4[1].format;
            if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar5 = pRVar4[1].ptr_ofs;
              lVar40 = pRVar4[1].stride * uVar36;
              auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40)),
                                      ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x10)),0x1c);
              auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x20)),0x28);
              in_ZMM6 = ZEXT1664(auVar67);
              auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 4)),
                                      ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x14)),0x1c);
              auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x24)),0x28);
              in_ZMM11 = ZEXT1664(auVar67);
              auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 8)),
                                      ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)),0x1c);
              auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x28)),0x28);
              in_ZMM9 = ZEXT1664(auVar67);
              auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),
                                      ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x1c)),0x1c);
              auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x2c)),0x28);
              in_ZMM12 = ZEXT1664(auVar67);
            }
            else if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar5 = pRVar4[1].ptr_ofs;
              lVar40 = pRVar4[1].stride * uVar36;
              auVar136._8_8_ = 0;
              auVar136._0_8_ = *(ulong *)(pcVar5 + lVar40 + 4);
              auVar246._8_8_ = 0;
              auVar246._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x10);
              auVar67 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40)),_DAT_01fbb140,
                                           auVar136);
              in_ZMM6 = ZEXT1664(auVar67);
              auVar67 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),_DAT_01fbb140,
                                           auVar246);
              in_ZMM11 = ZEXT1664(auVar67);
              auVar137._8_8_ = 0;
              auVar137._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x1c);
              auVar67 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)),_DAT_01fbb140,
                                           auVar137);
              in_ZMM9 = ZEXT1664(auVar67);
              auVar138._8_8_ = 0;
              auVar138._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x28);
              auVar67 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x24)),_DAT_01fbb140,
                                           auVar138);
              in_ZMM12 = ZEXT1664(auVar67);
            }
            else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar5 = pRVar4[1].ptr_ofs;
              lVar40 = pRVar4[1].stride * uVar36;
              auVar139._8_8_ = 0;
              auVar139._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x10);
              auVar67 = vinsertps_avx(auVar139,ZEXT416(*(uint *)(pcVar5 + lVar40 + 8)),0x20);
              auVar220._8_8_ = 0;
              auVar220._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x34);
              auVar49 = vpermt2ps_avx512vl(auVar220,_DAT_01fbb150,
                                           ZEXT416(*(uint *)(pcVar5 + lVar40)));
              auVar247._8_8_ = 0;
              auVar247._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x1c);
              auVar71 = vpermt2ps_avx512vl(auVar247,_DAT_01fbb150,
                                           ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)));
              uVar43 = *(uint *)(pcVar5 + lVar40 + 0x24);
              uVar105 = *(uint *)(pcVar5 + lVar40 + 0x28);
              uVar107 = *(uint *)(pcVar5 + lVar40 + 0x2c);
              uVar112 = *(uint *)(pcVar5 + lVar40 + 0x30);
              auVar68 = vmulss_avx512f(ZEXT416(uVar105),ZEXT416(uVar105));
              auVar68 = vfmadd231ss_avx512f(auVar68,ZEXT416(uVar43),ZEXT416(uVar43));
              auVar68 = vfmadd231ss_avx512f(auVar68,ZEXT416(uVar107),ZEXT416(uVar107));
              auVar68 = vfmadd231ss_avx512f(auVar68,ZEXT416(uVar112),ZEXT416(uVar112));
              auVar50 = vrsqrt14ss_avx512f(auVar62,ZEXT416(auVar68._0_4_));
              auVar65 = vmulss_avx512f(auVar50,ZEXT416(0x3fc00000));
              auVar68 = vmulss_avx512f(auVar68,ZEXT416(0xbf000000));
              auVar68 = vmulss_avx512f(auVar50,auVar68);
              auVar50 = vmulss_avx512f(auVar50,auVar50);
              auVar68 = vmulss_avx512f(auVar50,auVar68);
              auVar68 = vaddss_avx512f(auVar65,auVar68);
              auVar50 = vmulss_avx512f(ZEXT416(uVar43),auVar68);
              auVar71 = vinsertps_avx(auVar71,auVar50,0x30);
              in_ZMM12 = ZEXT1664(auVar71);
              auVar71 = vmulss_avx512f(ZEXT416(uVar105),auVar68);
              auVar71 = vinsertps_avx(auVar49,auVar71,0x30);
              in_ZMM6 = ZEXT1664(auVar71);
              auVar71 = vmulss_avx512f(ZEXT416(uVar107),auVar68);
              auVar49 = vmulss_avx512f(ZEXT416(uVar112),auVar68);
              auVar67 = vinsertps_avx(auVar67,auVar49,0x30);
              in_ZMM9 = ZEXT1664(auVar67);
              auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),
                                      ZEXT416(*(uint *)(pcVar5 + lVar40 + 4)),0x10);
              auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x3c)),0x20);
              auVar67 = vinsertps_avx(auVar67,auVar71,0x30);
              in_ZMM11 = ZEXT1664(auVar67);
            }
            else if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar5 = pRVar4[1].ptr_ofs;
              lVar40 = pRVar4[1].stride * uVar36;
              in_ZMM6 = ZEXT1664(*(undefined1 (*) [16])(pcVar5 + lVar40));
              in_ZMM11 = ZEXT1664(*(undefined1 (*) [16])(pcVar5 + lVar40 + 0x10));
              in_ZMM9 = ZEXT1664(*(undefined1 (*) [16])(pcVar5 + lVar40 + 0x20));
              in_ZMM12 = ZEXT1664(*(undefined1 (*) [16])(pcVar5 + lVar40 + 0x30));
            }
            bVar39 = bVar37 & (byte)uVar14 & 0xf;
            uVar41 = (ulong)(~bVar39 & bVar37);
            auVar71 = in_ZMM5._0_16_;
            auVar67 = vbroadcastss_avx512vl(auVar71);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM21 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar67._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM21._12_4_,
                                          CONCAT48((uint)bVar8 * auVar67._8_4_ |
                                                   (uint)!bVar8 * in_ZMM21._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar67._4_4_ |
                                                            (uint)!bVar7 * in_ZMM21._4_4_,
                                                            (uint)(bVar39 & 1) * auVar67._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM21._0_4_))));
            auVar67 = vshufps_avx512vl(auVar71,auVar71,0x55);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM24 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar67._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM24._12_4_,
                                          CONCAT48((uint)bVar8 * auVar67._8_4_ |
                                                   (uint)!bVar8 * in_ZMM24._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar67._4_4_ |
                                                            (uint)!bVar7 * in_ZMM24._4_4_,
                                                            (uint)(bVar39 & 1) * auVar67._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM24._0_4_))));
            auVar67 = vshufps_avx512vl(auVar71,auVar71,0xaa);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM20 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar67._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM20._12_4_,
                                          CONCAT48((uint)bVar8 * auVar67._8_4_ |
                                                   (uint)!bVar8 * in_ZMM20._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar67._4_4_ |
                                                            (uint)!bVar7 * in_ZMM20._4_4_,
                                                            (uint)(bVar39 & 1) * auVar67._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM20._0_4_))));
            auVar67 = vshufps_avx512vl(auVar71,auVar71,0xff);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM28 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar67._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM28._12_4_,
                                          CONCAT48((uint)bVar8 * auVar67._8_4_ |
                                                   (uint)!bVar8 * in_ZMM28._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar67._4_4_ |
                                                            (uint)!bVar7 * in_ZMM28._4_4_,
                                                            (uint)(bVar39 & 1) * auVar67._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM28._0_4_))));
            auVar71 = in_ZMM7._0_16_;
            auVar67 = vbroadcastss_avx512vl(auVar71);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM22 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar67._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM22._12_4_,
                                          CONCAT48((uint)bVar8 * auVar67._8_4_ |
                                                   (uint)!bVar8 * in_ZMM22._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar67._4_4_ |
                                                            (uint)!bVar7 * in_ZMM22._4_4_,
                                                            (uint)(bVar39 & 1) * auVar67._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM22._0_4_))));
            auVar67 = vshufps_avx512vl(auVar71,auVar71,0x55);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM19 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar67._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM19._12_4_,
                                          CONCAT48((uint)bVar8 * auVar67._8_4_ |
                                                   (uint)!bVar8 * in_ZMM19._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar67._4_4_ |
                                                            (uint)!bVar7 * in_ZMM19._4_4_,
                                                            (uint)(bVar39 & 1) * auVar67._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM19._0_4_))));
            auVar67 = vshufps_avx512vl(auVar71,auVar71,0xaa);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM23 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar67._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM23._12_4_,
                                          CONCAT48((uint)bVar8 * auVar67._8_4_ |
                                                   (uint)!bVar8 * in_ZMM23._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar67._4_4_ |
                                                            (uint)!bVar7 * in_ZMM23._4_4_,
                                                            (uint)(bVar39 & 1) * auVar67._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM23._0_4_))));
            auVar67 = vshufps_avx512vl(auVar71,auVar71,0xff);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM30 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar67._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM30._12_4_,
                                          CONCAT48((uint)bVar8 * auVar67._8_4_ |
                                                   (uint)!bVar8 * in_ZMM30._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar67._4_4_ |
                                                            (uint)!bVar7 * in_ZMM30._4_4_,
                                                            (uint)(bVar39 & 1) * auVar67._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM30._0_4_))));
            auVar71 = in_ZMM8._0_16_;
            auVar67 = vbroadcastss_avx512vl(auVar71);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            local_138._4_4_ = (uint)bVar7 * auVar67._4_4_ | (uint)!bVar7 * local_138._4_4_;
            local_138._0_4_ =
                 (uint)(bVar39 & 1) * auVar67._0_4_ | (uint)!(bool)(bVar39 & 1) * local_138._0_4_;
            local_138._8_4_ = (uint)bVar8 * auVar67._8_4_ | (uint)!bVar8 * local_138._8_4_;
            local_138._12_4_ =
                 (uint)(bVar39 >> 3) * auVar67._12_4_ |
                 (uint)!(bool)(bVar39 >> 3) * local_138._12_4_;
            auVar67 = vshufps_avx512vl(auVar71,auVar71,0x55);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            local_148._4_4_ = (uint)bVar7 * auVar67._4_4_ | (uint)!bVar7 * local_148._4_4_;
            local_148._0_4_ =
                 (uint)(bVar39 & 1) * auVar67._0_4_ | (uint)!(bool)(bVar39 & 1) * local_148._0_4_;
            local_148._8_4_ = (uint)bVar8 * auVar67._8_4_ | (uint)!bVar8 * local_148._8_4_;
            local_148._12_4_ =
                 (uint)(bVar39 >> 3) * auVar67._12_4_ |
                 (uint)!(bool)(bVar39 >> 3) * local_148._12_4_;
            auVar67 = vshufps_avx512vl(auVar71,auVar71,0xaa);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            local_178._4_4_ = (uint)bVar7 * auVar67._4_4_ | (uint)!bVar7 * local_178._4_4_;
            local_178._0_4_ =
                 (uint)(bVar39 & 1) * auVar67._0_4_ | (uint)!(bool)(bVar39 & 1) * local_178._0_4_;
            local_178._8_4_ = (uint)bVar8 * auVar67._8_4_ | (uint)!bVar8 * local_178._8_4_;
            local_178._12_4_ =
                 (uint)(bVar39 >> 3) * auVar67._12_4_ |
                 (uint)!(bool)(bVar39 >> 3) * local_178._12_4_;
            auVar67 = vshufps_avx512vl(auVar71,auVar71,0xff);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM31 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar67._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM31._12_4_,
                                          CONCAT48((uint)bVar8 * auVar67._8_4_ |
                                                   (uint)!bVar8 * in_ZMM31._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar67._4_4_ |
                                                            (uint)!bVar7 * in_ZMM31._4_4_,
                                                            (uint)(bVar39 & 1) * auVar67._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM31._0_4_))));
            auVar71 = in_ZMM10._0_16_;
            auVar67 = vbroadcastss_avx512vl(auVar71);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            local_168._4_4_ = (uint)bVar7 * auVar67._4_4_ | (uint)!bVar7 * local_168._4_4_;
            local_168._0_4_ =
                 (uint)(bVar39 & 1) * auVar67._0_4_ | (uint)!(bool)(bVar39 & 1) * local_168._0_4_;
            local_168._8_4_ = (uint)bVar8 * auVar67._8_4_ | (uint)!bVar8 * local_168._8_4_;
            local_168._12_4_ =
                 (uint)(bVar39 >> 3) * auVar67._12_4_ |
                 (uint)!(bool)(bVar39 >> 3) * local_168._12_4_;
            auVar67 = vshufps_avx512vl(auVar71,auVar71,0x55);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            local_158._4_4_ = (uint)bVar7 * auVar67._4_4_ | (uint)!bVar7 * local_158._4_4_;
            local_158._0_4_ =
                 (uint)(bVar39 & 1) * auVar67._0_4_ | (uint)!(bool)(bVar39 & 1) * local_158._0_4_;
            local_158._8_4_ = (uint)bVar8 * auVar67._8_4_ | (uint)!bVar8 * local_158._8_4_;
            local_158._12_4_ =
                 (uint)(bVar39 >> 3) * auVar67._12_4_ |
                 (uint)!(bool)(bVar39 >> 3) * local_158._12_4_;
            auVar67 = vshufps_avx512vl(auVar71,auVar71,0xaa);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            local_188._4_4_ = (uint)bVar7 * auVar67._4_4_ | (uint)!bVar7 * local_188._4_4_;
            local_188._0_4_ =
                 (uint)(bVar39 & 1) * auVar67._0_4_ | (uint)!(bool)(bVar39 & 1) * local_188._0_4_;
            local_188._8_4_ = (uint)bVar8 * auVar67._8_4_ | (uint)!bVar8 * local_188._8_4_;
            local_188._12_4_ =
                 (uint)(bVar39 >> 3) * auVar67._12_4_ |
                 (uint)!(bool)(bVar39 >> 3) * local_188._12_4_;
            auVar67 = vshufps_avx512vl(auVar71,auVar71,0xff);
            auVar99._0_4_ =
                 (uint)(bVar39 & 1) * auVar67._0_4_ | (uint)!(bool)(bVar39 & 1) * auVar66._0_4_;
            bVar7 = (bool)(bVar39 >> 1 & 1);
            auVar99._4_4_ = (uint)bVar7 * auVar67._4_4_ | (uint)!bVar7 * auVar66._4_4_;
            bVar7 = (bool)(bVar39 >> 2 & 1);
            auVar99._8_4_ = (uint)bVar7 * auVar67._8_4_ | (uint)!bVar7 * auVar66._8_4_;
            auVar99._12_4_ =
                 (uint)(bVar39 >> 3) * auVar67._12_4_ | (uint)!(bool)(bVar39 >> 3) * auVar66._12_4_;
            auVar67 = in_ZMM6._0_16_;
            auVar66 = vbroadcastss_avx512vl(auVar67);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            local_a8 = (float)((uint)(bVar39 & 1) * auVar66._0_4_ |
                              (uint)!(bool)(bVar39 & 1) * (int)local_a8);
            fStack_a4 = (float)((uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * (int)fStack_a4);
            fStack_a0 = (float)((uint)bVar8 * auVar66._8_4_ | (uint)!bVar8 * (int)fStack_a0);
            fStack_9c = (float)((uint)(bVar39 >> 3) * auVar66._12_4_ |
                               (uint)!(bool)(bVar39 >> 3) * (int)fStack_9c);
            auVar66 = vshufps_avx512vl(auVar67,auVar67,0x55);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            local_68 = (float)((uint)(bVar39 & 1) * auVar66._0_4_ |
                              (uint)!(bool)(bVar39 & 1) * (int)local_68);
            fStack_64 = (float)((uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * (int)fStack_64);
            fStack_60 = (float)((uint)bVar8 * auVar66._8_4_ | (uint)!bVar8 * (int)fStack_60);
            fStack_5c = (float)((uint)(bVar39 >> 3) * auVar66._12_4_ |
                               (uint)!(bool)(bVar39 >> 3) * (int)fStack_5c);
            auVar66 = vshufps_avx512vl(auVar67,auVar67,0xaa);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            local_58 = (float)((uint)(bVar39 & 1) * auVar66._0_4_ |
                              (uint)!(bool)(bVar39 & 1) * (int)local_58);
            fStack_54 = (float)((uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * (int)fStack_54);
            fStack_50 = (float)((uint)bVar8 * auVar66._8_4_ | (uint)!bVar8 * (int)fStack_50);
            fStack_4c = (float)((uint)(bVar39 >> 3) * auVar66._12_4_ |
                               (uint)!(bool)(bVar39 >> 3) * (int)fStack_4c);
            auVar66 = vshufps_avx512vl(auVar67,auVar67,0xff);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM25 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM25._12_4_,
                                          CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                   (uint)!bVar8 * in_ZMM25._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                            (uint)!bVar7 * in_ZMM25._4_4_,
                                                            (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM25._0_4_))));
            auVar67 = in_ZMM11._0_16_;
            auVar66 = vbroadcastss_avx512vl(auVar67);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            local_78 = (float)((uint)(bVar39 & 1) * auVar66._0_4_ |
                              (uint)!(bool)(bVar39 & 1) * (int)local_78);
            fStack_74 = (float)((uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * (int)fStack_74);
            fStack_70 = (float)((uint)bVar8 * auVar66._8_4_ | (uint)!bVar8 * (int)fStack_70);
            fStack_6c = (float)((uint)(bVar39 >> 3) * auVar66._12_4_ |
                               (uint)!(bool)(bVar39 >> 3) * (int)fStack_6c);
            auVar66 = vshufps_avx512vl(auVar67,auVar67,0x55);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            local_88 = (float)((uint)(bVar39 & 1) * auVar66._0_4_ |
                              (uint)!(bool)(bVar39 & 1) * (int)local_88);
            fStack_84 = (float)((uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * (int)fStack_84);
            fStack_80 = (float)((uint)bVar8 * auVar66._8_4_ | (uint)!bVar8 * (int)fStack_80);
            fStack_7c = (float)((uint)(bVar39 >> 3) * auVar66._12_4_ |
                               (uint)!(bool)(bVar39 >> 3) * (int)fStack_7c);
            auVar66 = vshufps_avx512vl(auVar67,auVar67,0xaa);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            local_98 = (float)((uint)(bVar39 & 1) * auVar66._0_4_ |
                              (uint)!(bool)(bVar39 & 1) * (int)local_98);
            fStack_94 = (float)((uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * (int)fStack_94);
            fStack_90 = (float)((uint)bVar8 * auVar66._8_4_ | (uint)!bVar8 * (int)fStack_90);
            fStack_8c = (float)((uint)(bVar39 >> 3) * auVar66._12_4_ |
                               (uint)!(bool)(bVar39 >> 3) * (int)fStack_8c);
            auVar66 = vshufps_avx512vl(auVar67,auVar67,0xff);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM26 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM26._12_4_,
                                          CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                   (uint)!bVar8 * in_ZMM26._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                            (uint)!bVar7 * in_ZMM26._4_4_,
                                                            (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM26._0_4_))));
            auVar67 = in_ZMM9._0_16_;
            auVar66 = vbroadcastss_avx512vl(auVar67);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            fStack_124 = (float)((uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * (int)fStack_124);
            local_128 = (float)((uint)(bVar39 & 1) * auVar66._0_4_ |
                               (uint)!(bool)(bVar39 & 1) * (int)local_128);
            fStack_120 = (float)((uint)bVar8 * auVar66._8_4_ | (uint)!bVar8 * (int)fStack_120);
            fStack_11c = (float)((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                (uint)!(bool)(bVar39 >> 3) * (int)fStack_11c);
            auVar66 = vshufps_avx512vl(auVar67,auVar67,0x55);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            fStack_e4 = (float)((uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * (int)fStack_e4);
            local_e8 = (float)((uint)(bVar39 & 1) * auVar66._0_4_ |
                              (uint)!(bool)(bVar39 & 1) * (int)local_e8);
            fStack_e0 = (float)((uint)bVar8 * auVar66._8_4_ | (uint)!bVar8 * (int)fStack_e0);
            fStack_dc = (float)((uint)(bVar39 >> 3) * auVar66._12_4_ |
                               (uint)!(bool)(bVar39 >> 3) * (int)fStack_dc);
            auVar66 = vshufps_avx512vl(auVar67,auVar67,0xaa);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            fStack_d4 = (float)((uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * (int)fStack_d4);
            local_d8 = (float)((uint)(bVar39 & 1) * auVar66._0_4_ |
                              (uint)!(bool)(bVar39 & 1) * (int)local_d8);
            fStack_d0 = (float)((uint)bVar8 * auVar66._8_4_ | (uint)!bVar8 * (int)fStack_d0);
            fStack_cc = (float)((uint)(bVar39 >> 3) * auVar66._12_4_ |
                               (uint)!(bool)(bVar39 >> 3) * (int)fStack_cc);
            auVar66 = vshufps_avx512vl(auVar67,auVar67,0xff);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM27 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM27._12_4_,
                                          CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                   (uint)!bVar8 * in_ZMM27._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                            (uint)!bVar7 * in_ZMM27._4_4_,
                                                            (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM27._0_4_))));
            auVar67 = in_ZMM12._0_16_;
            auVar66 = vbroadcastss_avx512vl(auVar67);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            fStack_f4 = (float)((uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * (int)fStack_f4);
            local_f8 = (float)((uint)(bVar39 & 1) * auVar66._0_4_ |
                              (uint)!(bool)(bVar39 & 1) * (int)local_f8);
            fStack_f0 = (float)((uint)bVar8 * auVar66._8_4_ | (uint)!bVar8 * (int)fStack_f0);
            fStack_ec = (float)((uint)(bVar39 >> 3) * auVar66._12_4_ |
                               (uint)!(bool)(bVar39 >> 3) * (int)fStack_ec);
            auVar66 = vshufps_avx512vl(auVar67,auVar67,0x55);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            fStack_104 = (float)((uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * (int)fStack_104);
            local_108 = (float)((uint)(bVar39 & 1) * auVar66._0_4_ |
                               (uint)!(bool)(bVar39 & 1) * (int)local_108);
            fStack_100 = (float)((uint)bVar8 * auVar66._8_4_ | (uint)!bVar8 * (int)fStack_100);
            fStack_fc = (float)((uint)(bVar39 >> 3) * auVar66._12_4_ |
                               (uint)!(bool)(bVar39 >> 3) * (int)fStack_fc);
            auVar66 = vshufps_avx512vl(auVar67,auVar67,0xaa);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            fStack_114 = (float)((uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * (int)fStack_114);
            local_118 = (float)((uint)(bVar39 & 1) * auVar66._0_4_ |
                               (uint)!(bool)(bVar39 & 1) * (int)local_118);
            fStack_110 = (float)((uint)bVar8 * auVar66._8_4_ | (uint)!bVar8 * (int)fStack_110);
            fStack_10c = (float)((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                (uint)!(bool)(bVar39 >> 3) * (int)fStack_10c);
            auVar66 = vshufps_avx512vl(auVar67,auVar67,0xff);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM29 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM29._12_4_,
                                          CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                   (uint)!bVar8 * in_ZMM29._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                            (uint)!bVar7 * in_ZMM29._4_4_,
                                                            (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM29._0_4_))));
            auVar66 = auVar99;
          }
          auVar62 = vmulps_avx512vl(in_ZMM29._0_16_,auVar66);
          auVar68 = vmulps_avx512vl(in_ZMM25._0_16_,auVar67);
          auVar50 = vmulps_avx512vl(in_ZMM26._0_16_,auVar71);
          auVar65 = vmulps_avx512vl(in_ZMM27._0_16_,auVar49);
          auVar140._0_4_ = auVar65._0_4_ + auVar50._0_4_ + auVar68._0_4_ + auVar62._0_4_;
          auVar140._4_4_ = auVar65._4_4_ + auVar50._4_4_ + auVar68._4_4_ + auVar62._4_4_;
          auVar140._8_4_ = auVar65._8_4_ + auVar50._8_4_ + auVar68._8_4_ + auVar62._8_4_;
          auVar140._12_4_ = auVar65._12_4_ + auVar50._12_4_ + auVar68._12_4_ + auVar62._12_4_;
          auVar221._8_4_ = 0x80000000;
          auVar221._0_8_ = 0x8000000080000000;
          auVar221._12_4_ = 0x80000000;
          uVar36 = CONCAT44(auVar140._4_4_,auVar140._0_4_);
          auVar178._0_8_ = uVar36 ^ 0x8000000080000000;
          auVar178._8_4_ = -auVar140._8_4_;
          auVar178._12_4_ = -auVar140._12_4_;
          uVar36 = vcmpps_avx512vl(auVar140,auVar178,1);
          auVar68._8_4_ = 0x7fffffff;
          auVar68._0_8_ = 0x7fffffff7fffffff;
          auVar68._12_4_ = 0x7fffffff;
          auVar62 = vandps_avx512vl(auVar140,auVar68);
          auVar50._8_4_ = 0xbb8d3753;
          auVar50._0_8_ = 0xbb8d3753bb8d3753;
          auVar50._12_4_ = 0xbb8d3753;
          auVar68 = vmulps_avx512vl(auVar62,auVar50);
          auVar65._8_4_ = 0x3c9df1b8;
          auVar65._0_8_ = 0x3c9df1b83c9df1b8;
          auVar65._12_4_ = 0x3c9df1b8;
          auVar68 = vaddps_avx512vl(auVar68,auVar65);
          fVar44 = auVar62._0_4_;
          auVar189._0_4_ = fVar44 * auVar68._0_4_;
          fVar45 = auVar62._4_4_;
          auVar189._4_4_ = fVar45 * auVar68._4_4_;
          fVar46 = auVar62._8_4_;
          auVar189._8_4_ = fVar46 * auVar68._8_4_;
          fVar47 = auVar62._12_4_;
          auVar189._12_4_ = fVar47 * auVar68._12_4_;
          auVar70._8_4_ = 0xbd37e81c;
          auVar70._0_8_ = 0xbd37e81cbd37e81c;
          auVar70._12_4_ = 0xbd37e81c;
          auVar68 = vaddps_avx512vl(auVar189,auVar70);
          auVar190._0_4_ = fVar44 * auVar68._0_4_;
          auVar190._4_4_ = fVar45 * auVar68._4_4_;
          auVar190._8_4_ = fVar46 * auVar68._8_4_;
          auVar190._12_4_ = fVar47 * auVar68._12_4_;
          auVar54._8_4_ = 0x3db3edac;
          auVar54._0_8_ = 0x3db3edac3db3edac;
          auVar54._12_4_ = 0x3db3edac;
          auVar50 = vaddps_avx512vl(auVar190,auVar54);
          auVar68 = vmaxps_avx(auVar178,auVar140);
          auVar141._0_4_ = fVar44 * auVar50._0_4_;
          auVar141._4_4_ = fVar45 * auVar50._4_4_;
          auVar141._8_4_ = fVar46 * auVar50._8_4_;
          auVar141._12_4_ = fVar47 * auVar50._12_4_;
          auVar55._8_4_ = 0xbe5ba881;
          auVar55._0_8_ = 0xbe5ba881be5ba881;
          auVar55._12_4_ = 0xbe5ba881;
          auVar50 = vaddps_avx512vl(auVar141,auVar55);
          auVar191._8_4_ = 0x3f800000;
          auVar191._0_8_ = 0x3f8000003f800000;
          auVar191._12_4_ = 0x3f800000;
          uVar41 = vcmpps_avx512vl(auVar62,auVar191,6);
          auVar142._0_4_ = fVar44 * auVar50._0_4_;
          auVar142._4_4_ = fVar45 * auVar50._4_4_;
          auVar142._8_4_ = fVar46 * auVar50._8_4_;
          auVar142._12_4_ = fVar47 * auVar50._12_4_;
          auVar56._8_4_ = 0x3fc90fd1;
          auVar56._0_8_ = 0x3fc90fd13fc90fd1;
          auVar56._12_4_ = 0x3fc90fd1;
          auVar50 = vaddps_avx512vl(auVar142,auVar56);
          auVar62 = vsubps_avx(auVar191,auVar62);
          auVar62 = vsqrtps_avx(auVar62);
          auVar143._0_4_ = auVar62._0_4_ * auVar50._0_4_;
          auVar143._4_4_ = auVar62._4_4_ * auVar50._4_4_;
          auVar143._8_4_ = auVar62._8_4_ * auVar50._8_4_;
          auVar143._12_4_ = auVar62._12_4_ * auVar50._12_4_;
          auVar140 = ZEXT816(0) << 0x20;
          uVar42 = vcmpps_avx512vl(auVar68,auVar140,1);
          auVar225._8_4_ = 0x3fc90fdb;
          auVar225._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar225._12_4_ = 0x3fc90fdb;
          auVar62 = vsubps_avx(auVar225,auVar143);
          auVar62 = vmaxps_avx(auVar140,auVar62);
          auVar50 = vxorps_avx512vl(auVar62,auVar221);
          bVar7 = (bool)((byte)uVar42 & 1);
          auVar85._0_4_ = (uint)bVar7 * auVar50._0_4_ | (uint)!bVar7 * auVar62._0_4_;
          bVar7 = (bool)((byte)(uVar42 >> 1) & 1);
          auVar85._4_4_ = (uint)bVar7 * auVar50._4_4_ | (uint)!bVar7 * auVar62._4_4_;
          bVar7 = (bool)((byte)(uVar42 >> 2) & 1);
          auVar85._8_4_ = (uint)bVar7 * auVar50._8_4_ | (uint)!bVar7 * auVar62._8_4_;
          bVar7 = (bool)((byte)(uVar42 >> 3) & 1);
          auVar85._12_4_ = (uint)bVar7 * auVar50._12_4_ | (uint)!bVar7 * auVar62._12_4_;
          auVar62 = vsubps_avx(auVar225,auVar85);
          auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fc00000));
          bVar7 = (bool)((byte)uVar41 & 1);
          bVar8 = (bool)((byte)(uVar41 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar41 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar41 >> 3) & 1);
          auVar144._0_4_ =
               fVar117 * (float)((uint)bVar7 * auVar50._0_4_ | (uint)!bVar7 * auVar62._0_4_);
          auVar144._4_4_ =
               fVar126 * (float)((uint)bVar8 * auVar50._4_4_ | (uint)!bVar8 * auVar62._4_4_);
          auVar144._8_4_ =
               fVar127 * (float)((uint)bVar9 * auVar50._8_4_ | (uint)!bVar9 * auVar62._8_4_);
          auVar144._12_4_ =
               fVar128 * (float)((uint)bVar10 * auVar50._12_4_ | (uint)!bVar10 * auVar62._12_4_);
          auVar57._8_4_ = 0x3f22f983;
          auVar57._0_8_ = 0x3f22f9833f22f983;
          auVar57._12_4_ = 0x3f22f983;
          auVar62 = vmulps_avx512vl(auVar144,auVar57);
          auVar62 = vroundps_avx(auVar62,1);
          auVar226._0_4_ = auVar62._0_4_ * 1.5707964;
          auVar226._4_4_ = auVar62._4_4_ * 1.5707964;
          auVar226._8_4_ = auVar62._8_4_ * 1.5707964;
          auVar226._12_4_ = auVar62._12_4_ * 1.5707964;
          auVar50 = vsubps_avx(auVar144,auVar226);
          auVar62 = vcvtps2dq_avx(auVar62);
          fVar44 = auVar50._0_4_;
          auVar236._0_4_ = fVar44 * fVar44;
          fVar45 = auVar50._4_4_;
          auVar236._4_4_ = fVar45 * fVar45;
          fVar46 = auVar50._8_4_;
          auVar236._8_4_ = fVar46 * fVar46;
          fVar47 = auVar50._12_4_;
          auVar236._12_4_ = fVar47 * fVar47;
          auVar58._8_4_ = 0xb2d70013;
          auVar58._0_8_ = 0xb2d70013b2d70013;
          auVar58._12_4_ = 0xb2d70013;
          auVar50 = vmulps_avx512vl(auVar236,auVar58);
          auVar59._8_4_ = 0x363938a8;
          auVar59._0_8_ = 0x363938a8363938a8;
          auVar59._12_4_ = 0x363938a8;
          auVar50 = vaddps_avx512vl(auVar50,auVar59);
          auVar60._8_4_ = 3;
          auVar60._0_8_ = 0x300000003;
          auVar60._12_4_ = 3;
          auVar65 = vpandd_avx512vl(auVar62,auVar60);
          auVar267._8_4_ = 1;
          auVar267._0_8_ = 0x100000001;
          auVar267._12_4_ = 1;
          auVar63._8_4_ = 0xb48b634d;
          auVar63._0_8_ = 0xb48b634db48b634d;
          auVar63._12_4_ = 0xb48b634d;
          auVar70 = vmulps_avx512vl(auVar236,auVar63);
          uVar42 = vptestnmd_avx512vl(auVar62,auVar267);
          uVar42 = uVar42 & 0xf;
          auVar64._8_4_ = 0x37cfab9c;
          auVar64._0_8_ = 0x37cfab9c37cfab9c;
          auVar64._12_4_ = 0x37cfab9c;
          auVar62 = vaddps_avx512vl(auVar70,auVar64);
          auVar248._0_4_ = auVar236._0_4_ * auVar50._0_4_;
          auVar248._4_4_ = auVar236._4_4_ * auVar50._4_4_;
          auVar248._8_4_ = auVar236._8_4_ * auVar50._8_4_;
          auVar248._12_4_ = auVar236._12_4_ * auVar50._12_4_;
          auVar78._8_4_ = 0xb9501096;
          auVar78._0_8_ = 0xb9501096b9501096;
          auVar78._12_4_ = 0xb9501096;
          auVar50 = vaddps_avx512vl(auVar248,auVar78);
          auVar227._0_4_ = auVar236._0_4_ * auVar62._0_4_;
          auVar227._4_4_ = auVar236._4_4_ * auVar62._4_4_;
          auVar227._8_4_ = auVar236._8_4_ * auVar62._8_4_;
          auVar227._12_4_ = auVar236._12_4_ * auVar62._12_4_;
          auVar79._8_4_ = 0xbab60981;
          auVar79._0_8_ = 0xbab60981bab60981;
          auVar79._12_4_ = 0xbab60981;
          auVar62 = vaddps_avx512vl(auVar227,auVar79);
          auVar249._0_4_ = auVar236._0_4_ * auVar50._0_4_;
          auVar249._4_4_ = auVar236._4_4_ * auVar50._4_4_;
          auVar249._8_4_ = auVar236._8_4_ * auVar50._8_4_;
          auVar249._12_4_ = auVar236._12_4_ * auVar50._12_4_;
          auVar80._8_4_ = 0x3c088898;
          auVar80._0_8_ = 0x3c0888983c088898;
          auVar80._12_4_ = 0x3c088898;
          auVar50 = vaddps_avx512vl(auVar249,auVar80);
          auVar228._0_4_ = auVar236._0_4_ * auVar62._0_4_;
          auVar228._4_4_ = auVar236._4_4_ * auVar62._4_4_;
          auVar228._8_4_ = auVar236._8_4_ * auVar62._8_4_;
          auVar228._12_4_ = auVar236._12_4_ * auVar62._12_4_;
          auVar81._8_4_ = 0x3d2aaaa4;
          auVar81._0_8_ = 0x3d2aaaa43d2aaaa4;
          auVar81._12_4_ = 0x3d2aaaa4;
          auVar62 = vaddps_avx512vl(auVar228,auVar81);
          auVar250._0_4_ = auVar236._0_4_ * auVar50._0_4_;
          auVar250._4_4_ = auVar236._4_4_ * auVar50._4_4_;
          auVar250._8_4_ = auVar236._8_4_ * auVar50._8_4_;
          auVar250._12_4_ = auVar236._12_4_ * auVar50._12_4_;
          auVar82._8_4_ = 0xbe2aaaab;
          auVar82._0_8_ = 0xbe2aaaabbe2aaaab;
          auVar82._12_4_ = 0xbe2aaaab;
          auVar50 = vaddps_avx512vl(auVar250,auVar82);
          uVar41 = vpcmpgtd_avx512vl(auVar65,auVar267);
          uVar41 = uVar41 & 0xf;
          fVar232 = auVar236._0_4_ * auVar50._0_4_ + 1.0;
          fVar241 = auVar236._4_4_ * auVar50._4_4_ + 1.0;
          fVar242 = auVar236._8_4_ * auVar50._8_4_ + 1.0;
          fVar243 = auVar236._12_4_ * auVar50._12_4_ + 1.0;
          auVar145._0_4_ = fVar232 * fVar44;
          auVar145._4_4_ = fVar241 * fVar45;
          auVar145._8_4_ = fVar242 * fVar46;
          auVar145._12_4_ = fVar243 * fVar47;
          auVar229._0_4_ = auVar236._0_4_ * (auVar236._0_4_ * auVar62._0_4_ + -0.5) + 1.0;
          auVar229._4_4_ = auVar236._4_4_ * (auVar236._4_4_ * auVar62._4_4_ + -0.5) + 1.0;
          auVar229._8_4_ = auVar236._8_4_ * (auVar236._8_4_ * auVar62._8_4_ + -0.5) + 1.0;
          auVar229._12_4_ = auVar236._12_4_ * (auVar236._12_4_ * auVar62._12_4_ + -0.5) + 1.0;
          auVar62 = vblendmps_avx512vl(auVar229,auVar145);
          bVar7 = (bool)((byte)uVar42 & 1);
          uVar43 = (uint)bVar7 * auVar62._0_4_ | (uint)!bVar7 * (int)fVar232;
          bVar7 = (bool)((byte)(uVar42 >> 1) & 1);
          uVar105 = (uint)bVar7 * auVar62._4_4_ | (uint)!bVar7 * (int)fVar241;
          bVar7 = (bool)((byte)(uVar42 >> 2) & 1);
          uVar107 = (uint)bVar7 * auVar62._8_4_ | (uint)!bVar7 * (int)fVar242;
          bVar7 = SUB81(uVar42 >> 3,0);
          uVar112 = (uint)bVar7 * auVar62._12_4_ | (uint)!bVar7 * (int)fVar243;
          bVar7 = (bool)((byte)uVar42 & 1);
          auVar86._0_4_ = (uint)bVar7 * (int)auVar229._0_4_ | (uint)!bVar7 * (int)auVar145._0_4_;
          bVar7 = (bool)((byte)(uVar42 >> 1) & 1);
          auVar86._4_4_ = (uint)bVar7 * (int)auVar229._4_4_ | (uint)!bVar7 * (int)auVar145._4_4_;
          bVar7 = (bool)((byte)(uVar42 >> 2) & 1);
          auVar86._8_4_ = (uint)bVar7 * (int)auVar229._8_4_ | (uint)!bVar7 * (int)auVar145._8_4_;
          bVar7 = SUB81(uVar42 >> 3,0);
          auVar86._12_4_ = (uint)bVar7 * (int)auVar229._12_4_ | (uint)!bVar7 * (int)auVar145._12_4_;
          auVar62 = vpcmpeqd_avx(auVar229,auVar229);
          auVar62 = vpaddd_avx(auVar65,auVar62);
          auVar84._8_4_ = 2;
          auVar84._0_8_ = 0x200000002;
          auVar84._12_4_ = 2;
          uVar42 = vpcmpud_avx512vl(auVar62,auVar84,1);
          uVar42 = uVar42 & 0xf;
          auVar62 = vxorps_avx512vl(in_ZMM29._0_16_,auVar221);
          bVar37 = (byte)uVar36;
          auVar100._0_4_ =
               (uint)(bVar37 & 1) * auVar62._0_4_ | (uint)!(bool)(bVar37 & 1) * in_ZMM29._0_4_;
          bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
          auVar100._4_4_ = (uint)bVar7 * auVar62._4_4_ | (uint)!bVar7 * in_ZMM29._4_4_;
          bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
          auVar100._8_4_ = (uint)bVar7 * auVar62._8_4_ | (uint)!bVar7 * in_ZMM29._8_4_;
          bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
          auVar100._12_4_ = (uint)bVar7 * auVar62._12_4_ | (uint)!bVar7 * in_ZMM29._12_4_;
          auVar62 = vxorps_avx512vl(in_ZMM25._0_16_,auVar221);
          auVar101._0_4_ =
               (uint)(bVar37 & 1) * auVar62._0_4_ | (uint)!(bool)(bVar37 & 1) * in_ZMM25._0_4_;
          bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
          auVar101._4_4_ = (uint)bVar7 * auVar62._4_4_ | (uint)!bVar7 * in_ZMM25._4_4_;
          bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
          auVar101._8_4_ = (uint)bVar7 * auVar62._8_4_ | (uint)!bVar7 * in_ZMM25._8_4_;
          bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
          auVar101._12_4_ = (uint)bVar7 * auVar62._12_4_ | (uint)!bVar7 * in_ZMM25._12_4_;
          auVar62 = vfmsub213ps_avx512vl(auVar66,auVar68,auVar100);
          auVar50 = vfmsub213ps_avx512vl(auVar67,auVar68,auVar101);
          fVar44 = auVar62._0_4_;
          fVar241 = auVar62._4_4_;
          fVar110 = auVar62._8_4_;
          fVar116 = auVar62._12_4_;
          fVar45 = auVar50._0_4_;
          fVar242 = auVar50._4_4_;
          fVar111 = auVar50._8_4_;
          fVar11 = auVar50._12_4_;
          auVar62 = vxorps_avx512vl(in_ZMM26._0_16_,auVar221);
          auVar102._0_4_ =
               (uint)(bVar37 & 1) * auVar62._0_4_ | (uint)!(bool)(bVar37 & 1) * in_ZMM26._0_4_;
          bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
          auVar102._4_4_ = (uint)bVar7 * auVar62._4_4_ | (uint)!bVar7 * in_ZMM26._4_4_;
          bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
          auVar102._8_4_ = (uint)bVar7 * auVar62._8_4_ | (uint)!bVar7 * in_ZMM26._8_4_;
          bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
          auVar102._12_4_ = (uint)bVar7 * auVar62._12_4_ | (uint)!bVar7 * in_ZMM26._12_4_;
          auVar62 = vfmsub213ps_avx512vl(auVar71,auVar68,auVar102);
          fVar46 = auVar62._0_4_;
          fVar243 = auVar62._4_4_;
          fVar114 = auVar62._8_4_;
          fVar12 = auVar62._12_4_;
          auVar62 = vxorps_avx512vl(in_ZMM27._0_16_,auVar221);
          auVar103._0_4_ =
               (uint)(bVar37 & 1) * auVar62._0_4_ | (uint)!(bool)(bVar37 & 1) * in_ZMM27._0_4_;
          bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
          auVar103._4_4_ = (uint)bVar7 * auVar62._4_4_ | (uint)!bVar7 * in_ZMM27._4_4_;
          bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
          auVar103._8_4_ = (uint)bVar7 * auVar62._8_4_ | (uint)!bVar7 * in_ZMM27._8_4_;
          bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
          auVar103._12_4_ = (uint)bVar7 * auVar62._12_4_ | (uint)!bVar7 * in_ZMM27._12_4_;
          auVar62 = vfmsub213ps_avx512vl(auVar49,auVar68,auVar103);
          fVar47 = auVar62._0_4_;
          fVar109 = auVar62._4_4_;
          fVar115 = auVar62._8_4_;
          fVar13 = auVar62._12_4_;
          auVar276._0_4_ = fVar47 * fVar47 + fVar46 * fVar46 + fVar44 * fVar44 + fVar45 * fVar45;
          auVar276._4_4_ =
               fVar109 * fVar109 + fVar243 * fVar243 + fVar241 * fVar241 + fVar242 * fVar242;
          auVar276._8_4_ =
               fVar115 * fVar115 + fVar114 * fVar114 + fVar110 * fVar110 + fVar111 * fVar111;
          auVar276._12_4_ = fVar13 * fVar13 + fVar12 * fVar12 + fVar116 * fVar116 + fVar11 * fVar11;
          auVar62 = vrsqrt14ps_avx512vl(auVar276);
          fVar232 = auVar62._0_4_;
          fVar106 = auVar62._4_4_;
          fVar108 = auVar62._8_4_;
          fVar113 = auVar62._12_4_;
          auVar277._0_4_ = auVar276._0_4_ * -0.5 * fVar232 * fVar232 * fVar232;
          auVar277._4_4_ = auVar276._4_4_ * -0.5 * fVar106 * fVar106 * fVar106;
          auVar277._8_4_ = auVar276._8_4_ * -0.5 * fVar108 * fVar108 * fVar108;
          auVar277._12_4_ = auVar276._12_4_ * -0.5 * fVar113 * fVar113 * fVar113;
          auVar303._8_4_ = 0x3fc00000;
          auVar303._0_8_ = 0x3fc000003fc00000;
          auVar303._12_4_ = 0x3fc00000;
          auVar62 = vfmadd231ps_fma(auVar277,auVar303,auVar62);
          fVar271 = auVar62._0_4_;
          fVar280 = auVar62._4_4_;
          fVar281 = auVar62._8_4_;
          fVar282 = auVar62._12_4_;
          auVar62 = vxorps_avx512vl(auVar86,auVar221);
          bVar7 = (bool)((byte)uVar42 & 1);
          auVar104._0_4_ = (uint)bVar7 * auVar62._0_4_ | !bVar7 * auVar86._0_4_;
          bVar7 = (bool)((byte)(uVar42 >> 1) & 1);
          auVar104._4_4_ = (uint)bVar7 * auVar62._4_4_ | !bVar7 * auVar86._4_4_;
          bVar7 = (bool)((byte)(uVar42 >> 2) & 1);
          auVar104._8_4_ = (uint)bVar7 * auVar62._8_4_ | !bVar7 * auVar86._8_4_;
          bVar7 = SUB81(uVar42 >> 3,0);
          auVar104._12_4_ = (uint)bVar7 * auVar62._12_4_ | !bVar7 * auVar86._12_4_;
          bVar7 = (bool)((byte)uVar41 & 1);
          fVar232 = (float)(bVar7 * uVar43 | (uint)!bVar7 * (uVar43 ^ 0x80000000));
          bVar7 = (bool)((byte)(uVar41 >> 1) & 1);
          fVar106 = (float)(bVar7 * uVar105 | (uint)!bVar7 * (uVar105 ^ 0x80000000));
          bVar7 = (bool)((byte)(uVar41 >> 2) & 1);
          fVar108 = (float)(bVar7 * uVar107 | (uint)!bVar7 * (uVar107 ^ 0x80000000));
          bVar7 = SUB81(uVar41 >> 3,0);
          fVar113 = (float)(bVar7 * uVar112 | (uint)!bVar7 * (uVar112 ^ 0x80000000));
          auVar222._0_4_ = fVar232 * fVar271 * fVar44;
          auVar222._4_4_ = fVar106 * fVar280 * fVar241;
          auVar222._8_4_ = fVar108 * fVar281 * fVar110;
          auVar222._12_4_ = fVar113 * fVar282 * fVar116;
          auVar230._0_4_ = fVar45 * fVar271 * fVar232;
          auVar230._4_4_ = fVar242 * fVar280 * fVar106;
          auVar230._8_4_ = fVar111 * fVar281 * fVar108;
          auVar230._12_4_ = fVar11 * fVar282 * fVar113;
          auVar237._0_4_ = fVar46 * fVar271 * fVar232;
          auVar237._4_4_ = fVar243 * fVar280 * fVar106;
          auVar237._8_4_ = fVar114 * fVar281 * fVar108;
          auVar237._12_4_ = fVar12 * fVar282 * fVar113;
          auVar251._0_4_ = fVar47 * fVar271 * fVar232;
          auVar251._4_4_ = fVar109 * fVar280 * fVar106;
          auVar251._8_4_ = fVar115 * fVar281 * fVar108;
          auVar251._12_4_ = fVar13 * fVar282 * fVar113;
          auVar62 = vfmadd231ps_fma(auVar222,auVar104,auVar66);
          auVar50 = vfmadd231ps_avx512vl(auVar230,auVar104,auVar67);
          auVar65 = vfmadd231ps_avx512vl(auVar237,auVar104,auVar71);
          auVar70 = vfmadd231ps_avx512vl(auVar251,auVar49,auVar104);
          auVar48 = vsubps_avx512vl(auVar100,auVar66);
          auVar66 = vfmadd213ps_fma(auVar48,auVar61,auVar66);
          auVar48 = vsubps_avx512vl(auVar101,auVar67);
          auVar48 = vfmadd213ps_avx512vl(auVar48,auVar61,auVar67);
          auVar67 = vsubps_avx512vl(auVar102,auVar71);
          auVar69 = vfmadd213ps_avx512vl(auVar67,auVar61,auVar71);
          auVar67 = vsubps_avx512vl(auVar103,auVar49);
          auVar49 = vfmadd213ps_avx512vl(auVar67,auVar61,auVar49);
          auVar296._0_4_ =
               auVar49._0_4_ * auVar49._0_4_ +
               auVar69._0_4_ * auVar69._0_4_ +
               auVar66._0_4_ * auVar66._0_4_ + auVar48._0_4_ * auVar48._0_4_;
          auVar296._4_4_ =
               auVar49._4_4_ * auVar49._4_4_ +
               auVar69._4_4_ * auVar69._4_4_ +
               auVar66._4_4_ * auVar66._4_4_ + auVar48._4_4_ * auVar48._4_4_;
          auVar296._8_4_ =
               auVar49._8_4_ * auVar49._8_4_ +
               auVar69._8_4_ * auVar69._8_4_ +
               auVar66._8_4_ * auVar66._8_4_ + auVar48._8_4_ * auVar48._8_4_;
          auVar296._12_4_ =
               auVar49._12_4_ * auVar49._12_4_ +
               auVar69._12_4_ * auVar69._12_4_ +
               auVar66._12_4_ * auVar66._12_4_ + auVar48._12_4_ * auVar48._12_4_;
          auVar67 = vrsqrt14ps_avx512vl(auVar296);
          fVar44 = auVar67._0_4_;
          fVar45 = auVar67._4_4_;
          fVar46 = auVar67._8_4_;
          fVar47 = auVar67._12_4_;
          auVar268._0_4_ = auVar296._0_4_ * -0.5 * fVar44 * fVar44 * fVar44;
          auVar268._4_4_ = auVar296._4_4_ * -0.5 * fVar45 * fVar45 * fVar45;
          auVar268._8_4_ = auVar296._8_4_ * -0.5 * fVar46 * fVar46 * fVar46;
          auVar268._12_4_ = auVar296._12_4_ * -0.5 * fVar47 * fVar47 * fVar47;
          auVar67 = vfmadd231ps_fma(auVar268,auVar67,auVar303);
          auVar71._8_4_ = 0x3f7fdf3b;
          auVar71._0_8_ = 0x3f7fdf3b3f7fdf3b;
          auVar71._12_4_ = 0x3f7fdf3b;
          uVar36 = vcmpps_avx512vl(auVar68,auVar71,6);
          auVar66 = vmulps_avx512vl(auVar66,auVar67);
          bVar37 = (byte)uVar36;
          fVar44 = (float)((uint)(bVar37 & 1) * auVar66._0_4_ |
                          (uint)!(bool)(bVar37 & 1) * auVar62._0_4_);
          bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
          fVar232 = (float)((uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * auVar62._4_4_);
          bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
          fVar109 = (float)((uint)bVar7 * auVar66._8_4_ | (uint)!bVar7 * auVar62._8_4_);
          bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
          fVar114 = (float)((uint)bVar7 * auVar66._12_4_ | (uint)!bVar7 * auVar62._12_4_);
          auVar66 = vmulps_avx512vl(auVar48,auVar67);
          fVar45 = (float)((uint)(bVar37 & 1) * auVar66._0_4_ |
                          (uint)!(bool)(bVar37 & 1) * auVar50._0_4_);
          bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
          fVar241 = (float)((uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * auVar50._4_4_);
          bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
          fVar106 = (float)((uint)bVar7 * auVar66._8_4_ | (uint)!bVar7 * auVar50._8_4_);
          bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
          fVar115 = (float)((uint)bVar7 * auVar66._12_4_ | (uint)!bVar7 * auVar50._12_4_);
          auVar66 = vmulps_avx512vl(auVar69,auVar67);
          fVar46 = (float)((uint)(bVar37 & 1) * auVar66._0_4_ |
                          (uint)!(bool)(bVar37 & 1) * auVar65._0_4_);
          bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
          fVar242 = (float)((uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * auVar65._4_4_);
          bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
          fVar110 = (float)((uint)bVar7 * auVar66._8_4_ | (uint)!bVar7 * auVar65._8_4_);
          bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
          fVar108 = (float)((uint)bVar7 * auVar66._12_4_ | (uint)!bVar7 * auVar65._12_4_);
          auVar66 = vmulps_avx512vl(auVar49,auVar67);
          fVar47 = (float)((uint)(bVar37 & 1) * auVar66._0_4_ |
                          (uint)!(bool)(bVar37 & 1) * auVar70._0_4_);
          bVar7 = (bool)((byte)(uVar36 >> 1) & 1);
          fVar243 = (float)((uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * auVar70._4_4_);
          bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
          fVar111 = (float)((uint)bVar7 * auVar66._8_4_ | (uint)!bVar7 * auVar70._8_4_);
          bVar7 = (bool)((byte)(uVar36 >> 3) & 1);
          fVar116 = (float)((uint)bVar7 * auVar66._12_4_ | (uint)!bVar7 * auVar70._12_4_);
          auVar66 = vsubps_avx(auVar191,auVar61);
          auVar158._0_4_ = fVar117 * local_a8;
          auVar158._4_4_ = fVar126 * fStack_a4;
          auVar158._8_4_ = fVar127 * fStack_a0;
          auVar158._12_4_ = fVar128 * fStack_9c;
          auVar68 = vfmadd213ps_avx512vl(in_ZMM21._0_16_,auVar66,auVar158);
          auVar159._0_4_ = fVar117 * local_68;
          auVar159._4_4_ = fVar126 * fStack_64;
          auVar159._8_4_ = fVar127 * fStack_60;
          auVar159._12_4_ = fVar128 * fStack_5c;
          auVar50 = vfmadd213ps_avx512vl(in_ZMM24._0_16_,auVar66,auVar159);
          auVar160._0_4_ = fVar117 * local_58;
          auVar160._4_4_ = fVar126 * fStack_54;
          auVar160._8_4_ = fVar127 * fStack_50;
          auVar160._12_4_ = fVar128 * fStack_4c;
          auVar65 = vfmadd213ps_avx512vl(in_ZMM20._0_16_,auVar66,auVar160);
          auVar161._0_4_ = fVar117 * local_78;
          auVar161._4_4_ = fVar126 * fStack_74;
          auVar161._8_4_ = fVar127 * fStack_70;
          auVar161._12_4_ = fVar128 * fStack_6c;
          auVar192._0_4_ = fVar117 * local_88;
          auVar192._4_4_ = fVar126 * fStack_84;
          auVar192._8_4_ = fVar127 * fStack_80;
          auVar192._12_4_ = fVar128 * fStack_7c;
          auVar212._0_4_ = fVar117 * local_98;
          auVar212._4_4_ = fVar126 * fStack_94;
          auVar212._8_4_ = fVar127 * fStack_90;
          auVar212._12_4_ = fVar128 * fStack_8c;
          auVar70 = vfmadd213ps_avx512vl(in_ZMM22._0_16_,auVar66,auVar161);
          auVar48 = vfmadd213ps_avx512vl(in_ZMM19._0_16_,auVar66,auVar192);
          auVar69 = vfmadd213ps_avx512vl(in_ZMM23._0_16_,auVar66,auVar212);
          auVar162._0_4_ = fVar117 * local_128;
          auVar162._4_4_ = fVar126 * fStack_124;
          auVar162._8_4_ = fVar127 * fStack_120;
          auVar162._12_4_ = fVar128 * fStack_11c;
          auVar193._0_4_ = fVar117 * local_e8;
          auVar193._4_4_ = fVar126 * fStack_e4;
          auVar193._8_4_ = fVar127 * fStack_e0;
          auVar193._12_4_ = fVar128 * fStack_dc;
          auVar213._0_4_ = fVar117 * local_d8;
          auVar213._4_4_ = fVar126 * fStack_d4;
          auVar213._8_4_ = fVar127 * fStack_d0;
          auVar213._12_4_ = fVar128 * fStack_cc;
          auVar53 = vfmadd213ps_avx512vl(local_138,auVar66,auVar162);
          auVar54 = vfmadd213ps_avx512vl(local_148,auVar66,auVar193);
          auVar55 = vfmadd213ps_avx512vl(local_178,auVar66,auVar213);
          auVar163._0_4_ = fVar117 * local_f8;
          auVar163._4_4_ = fVar126 * fStack_f4;
          auVar163._8_4_ = fVar127 * fStack_f0;
          auVar163._12_4_ = fVar128 * fStack_ec;
          auVar194._0_4_ = fVar117 * local_108;
          auVar194._4_4_ = fVar126 * fStack_104;
          auVar194._8_4_ = fVar127 * fStack_100;
          auVar194._12_4_ = fVar128 * fStack_fc;
          auVar49._0_4_ = fVar117 * local_118;
          auVar49._4_4_ = fVar126 * fStack_114;
          auVar49._8_4_ = fVar127 * fStack_110;
          auVar49._12_4_ = fVar128 * fStack_10c;
          auVar56 = vfmadd213ps_avx512vl(local_168,auVar66,auVar163);
          auVar57 = vfmadd213ps_avx512vl(local_158,auVar66,auVar194);
          auVar58 = vfmadd213ps_avx512vl(local_188,auVar66,auVar49);
          auVar146._0_4_ = fVar44 * fVar44;
          auVar146._4_4_ = fVar232 * fVar232;
          auVar146._8_4_ = fVar109 * fVar109;
          auVar146._12_4_ = fVar114 * fVar114;
          auVar195._0_4_ = fVar45 * fVar45;
          auVar195._4_4_ = fVar241 * fVar241;
          auVar195._8_4_ = fVar106 * fVar106;
          auVar195._12_4_ = fVar115 * fVar115;
          auVar124._0_4_ = auVar146._0_4_ + auVar195._0_4_;
          auVar124._4_4_ = auVar146._4_4_ + auVar195._4_4_;
          auVar124._8_4_ = auVar146._8_4_ + auVar195._8_4_;
          auVar124._12_4_ = auVar146._12_4_ + auVar195._12_4_;
          auVar214._0_4_ = fVar46 * fVar46;
          auVar214._4_4_ = fVar242 * fVar242;
          auVar214._8_4_ = fVar110 * fVar110;
          auVar214._12_4_ = fVar108 * fVar108;
          auVar66 = vsubps_avx(auVar124,auVar214);
          auVar290._0_4_ = fVar47 * fVar47;
          auVar290._4_4_ = fVar243 * fVar243;
          auVar290._8_4_ = fVar111 * fVar111;
          auVar290._12_4_ = fVar116 * fVar116;
          auVar66 = vsubps_avx(auVar66,auVar290);
          auVar269._0_4_ = fVar46 * fVar45;
          auVar269._4_4_ = fVar242 * fVar241;
          auVar269._8_4_ = fVar110 * fVar106;
          auVar269._12_4_ = fVar108 * fVar115;
          auVar278._0_4_ = fVar47 * fVar44;
          auVar278._4_4_ = fVar243 * fVar232;
          auVar278._8_4_ = fVar111 * fVar109;
          auVar278._12_4_ = fVar116 * fVar114;
          auVar125._0_4_ = auVar269._0_4_ + auVar278._0_4_ + auVar269._0_4_ + auVar278._0_4_;
          auVar125._4_4_ = auVar269._4_4_ + auVar278._4_4_ + auVar269._4_4_ + auVar278._4_4_;
          auVar125._8_4_ = auVar269._8_4_ + auVar278._8_4_ + auVar269._8_4_ + auVar278._8_4_;
          auVar125._12_4_ = auVar269._12_4_ + auVar278._12_4_ + auVar269._12_4_ + auVar278._12_4_;
          auVar297._0_4_ = fVar47 * fVar45;
          auVar297._4_4_ = fVar243 * fVar241;
          auVar297._8_4_ = fVar111 * fVar106;
          auVar297._12_4_ = fVar116 * fVar115;
          auVar299._0_4_ = fVar46 * fVar44;
          auVar299._4_4_ = fVar242 * fVar232;
          auVar299._8_4_ = fVar110 * fVar109;
          auVar299._12_4_ = fVar108 * fVar114;
          auVar67 = vsubps_avx(auVar297,auVar299);
          auVar304._0_4_ = auVar67._0_4_ + auVar67._0_4_;
          auVar304._4_4_ = auVar67._4_4_ + auVar67._4_4_;
          auVar304._8_4_ = auVar67._8_4_ + auVar67._8_4_;
          auVar304._12_4_ = auVar67._12_4_ + auVar67._12_4_;
          auVar67 = vsubps_avx(auVar269,auVar278);
          auVar59 = vaddps_avx512vl(auVar67,auVar67);
          auVar67 = vsubps_avx(auVar146,auVar195);
          auVar196._0_4_ = auVar214._0_4_ + auVar67._0_4_;
          auVar196._4_4_ = auVar214._4_4_ + auVar67._4_4_;
          auVar196._8_4_ = auVar214._8_4_ + auVar67._8_4_;
          auVar196._12_4_ = auVar214._12_4_ + auVar67._12_4_;
          auVar61 = vsubps_avx(auVar196,auVar290);
          auVar197._0_4_ = fVar46 * fVar47;
          auVar197._4_4_ = fVar242 * fVar243;
          auVar197._8_4_ = fVar110 * fVar111;
          auVar197._12_4_ = fVar108 * fVar116;
          auVar223._0_4_ = fVar44 * fVar45;
          auVar223._4_4_ = fVar232 * fVar241;
          auVar223._8_4_ = fVar109 * fVar106;
          auVar223._12_4_ = fVar114 * fVar115;
          auVar231._0_4_ = auVar197._0_4_ + auVar223._0_4_ + auVar197._0_4_ + auVar223._0_4_;
          auVar231._4_4_ = auVar197._4_4_ + auVar223._4_4_ + auVar197._4_4_ + auVar223._4_4_;
          auVar231._8_4_ = auVar197._8_4_ + auVar223._8_4_ + auVar197._8_4_ + auVar223._8_4_;
          auVar231._12_4_ = auVar197._12_4_ + auVar223._12_4_ + auVar197._12_4_ + auVar223._12_4_;
          auVar238._0_4_ = auVar297._0_4_ + auVar299._0_4_ + auVar297._0_4_ + auVar299._0_4_;
          auVar238._4_4_ = auVar297._4_4_ + auVar299._4_4_ + auVar297._4_4_ + auVar299._4_4_;
          auVar238._8_4_ = auVar297._8_4_ + auVar299._8_4_ + auVar297._8_4_ + auVar299._8_4_;
          auVar238._12_4_ = auVar297._12_4_ + auVar299._12_4_ + auVar297._12_4_ + auVar299._12_4_;
          auVar62 = vsubps_avx(auVar197,auVar223);
          auVar279._0_4_ = auVar62._0_4_ + auVar62._0_4_;
          auVar279._4_4_ = auVar62._4_4_ + auVar62._4_4_;
          auVar279._8_4_ = auVar62._8_4_ + auVar62._8_4_;
          auVar279._12_4_ = auVar62._12_4_ + auVar62._12_4_;
          auVar67 = vsubps_avx(auVar67,auVar214);
          auVar147._0_4_ = auVar290._0_4_ + auVar67._0_4_;
          auVar147._4_4_ = auVar290._4_4_ + auVar67._4_4_;
          auVar147._8_4_ = auVar290._8_4_ + auVar67._8_4_;
          auVar147._12_4_ = auVar290._12_4_ + auVar67._12_4_;
          auVar198._0_4_ = auVar304._0_4_ * 0.0;
          auVar198._4_4_ = auVar304._4_4_ * 0.0;
          auVar198._8_4_ = auVar304._8_4_ * 0.0;
          auVar198._12_4_ = auVar304._12_4_ * 0.0;
          auVar67 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar125,auVar198);
          auVar215._0_4_ = auVar125._0_4_ + auVar198._0_4_;
          auVar215._4_4_ = auVar125._4_4_ + auVar198._4_4_;
          auVar215._8_4_ = auVar125._8_4_ + auVar198._8_4_;
          auVar215._12_4_ = auVar125._12_4_ + auVar198._12_4_;
          auVar62 = vfmadd213ps_fma(auVar125,auVar140,auVar304);
          auVar71 = vfmadd231ps_fma(auVar215,auVar66,auVar140);
          auVar49 = vfmadd231ps_fma(auVar62,auVar140,auVar66);
          auVar199._0_4_ = auVar231._0_4_ * 0.0;
          auVar199._4_4_ = auVar231._4_4_ * 0.0;
          auVar199._8_4_ = auVar231._8_4_ * 0.0;
          auVar199._12_4_ = auVar231._12_4_ * 0.0;
          auVar62 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar61,auVar199);
          auVar291._0_4_ = auVar61._0_4_ + auVar199._0_4_;
          auVar291._4_4_ = auVar61._4_4_ + auVar199._4_4_;
          auVar291._8_4_ = auVar61._8_4_ + auVar199._8_4_;
          auVar291._12_4_ = auVar61._12_4_ + auVar199._12_4_;
          auVar61 = vfmadd213ps_fma(auVar61,auVar140,auVar231);
          auVar60 = vaddps_avx512vl(auVar59,auVar62);
          auVar63 = vfmadd231ps_avx512vl(auVar291,auVar59,auVar140);
          auVar59 = vfmadd231ps_avx512vl(auVar61,auVar140,auVar59);
          auVar200._0_4_ = auVar147._0_4_ * 0.0;
          auVar200._4_4_ = auVar147._4_4_ * 0.0;
          auVar200._8_4_ = auVar147._8_4_ * 0.0;
          auVar200._12_4_ = auVar147._12_4_ * 0.0;
          auVar61 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar279,auVar200);
          auVar64 = vaddps_avx512vl(auVar279,auVar200);
          auVar62 = vfmadd213ps_fma(auVar279,auVar140,auVar147);
          auVar148._0_4_ = auVar238._0_4_ + auVar61._0_4_;
          auVar148._4_4_ = auVar238._4_4_ + auVar61._4_4_;
          auVar148._8_4_ = auVar238._8_4_ + auVar61._8_4_;
          auVar148._12_4_ = auVar238._12_4_ + auVar61._12_4_;
          auVar64 = vfmadd231ps_avx512vl(auVar64,auVar238,auVar140);
          auVar62 = vfmadd231ps_fma(auVar62,auVar140,auVar238);
          auVar50 = vaddps_avx512vl(auVar50,auVar140);
          auVar65 = vaddps_avx512vl(auVar65,auVar140);
          auVar69 = vaddps_avx512vl(auVar69,auVar140);
          auVar239._0_4_ = auVar148._0_4_ * 0.0;
          auVar239._4_4_ = auVar148._4_4_ * 0.0;
          auVar239._8_4_ = auVar148._8_4_ * 0.0;
          auVar239._12_4_ = auVar148._12_4_ * 0.0;
          auVar78 = vmulps_avx512vl(auVar64,auVar140);
          auVar79 = vmulps_avx512vl(auVar62,auVar140);
          auVar80 = vfmadd213ps_avx512vl(ZEXT416(0) << 0x20,auVar60,auVar239);
          auVar61 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar63,auVar78);
          auVar81 = vfmadd213ps_avx512vl(auVar140,auVar59,auVar79);
          auVar82 = vfmadd231ps_avx512vl(auVar239,auVar48,auVar60);
          auVar78 = vfmadd231ps_avx512vl(auVar78,auVar48,auVar63);
          auVar48 = vfmadd213ps_avx512vl(auVar48,auVar59,auVar79);
          auVar79 = vmulps_avx512vl(auVar55,auVar148);
          auVar84 = vmulps_avx512vl(auVar55,auVar64);
          auVar55 = vmulps_avx512vl(auVar55,auVar62);
          auVar79 = vfmadd231ps_avx512vl(auVar79,auVar54,auVar60);
          auVar84 = vfmadd231ps_avx512vl(auVar84,auVar54,auVar63);
          auVar54 = vfmadd231ps_avx512vl(auVar55,auVar59,auVar54);
          auVar55 = vmulps_avx512vl(auVar58,auVar148);
          auVar64 = vmulps_avx512vl(auVar58,auVar64);
          auVar62 = vmulps_avx512vl(auVar58,auVar62);
          auVar55 = vfmadd231ps_avx512vl(auVar55,auVar57,auVar60);
          auVar58 = vfmadd231ps_avx512vl(auVar64,auVar57,auVar63);
          auVar62 = vfmadd231ps_avx512vl(auVar62,auVar57,auVar59);
          auVar164._0_4_ = auVar67._0_4_ + auVar66._0_4_;
          auVar164._4_4_ = auVar67._4_4_ + auVar66._4_4_;
          auVar164._8_4_ = auVar67._8_4_ + auVar66._8_4_;
          auVar164._12_4_ = auVar67._12_4_ + auVar66._12_4_;
          auVar66 = vfmadd231ps_avx512vl(auVar80,auVar68,auVar164);
          auVar67 = vfmadd231ps_avx512vl(auVar61,auVar68,auVar71);
          auVar61 = vfmadd231ps_avx512vl(auVar81,auVar49,auVar68);
          auVar68 = vfmadd231ps_avx512vl(auVar82,auVar70,auVar164);
          auVar57 = vfmadd231ps_avx512vl(auVar78,auVar70,auVar71);
          auVar70 = vfmadd231ps_avx512vl(auVar48,auVar49,auVar70);
          auVar48 = vfmadd231ps_avx512vl(auVar79,auVar53,auVar164);
          auVar59 = vfmadd231ps_avx512vl(auVar84,auVar53,auVar71);
          auVar53 = vfmadd231ps_avx512vl(auVar54,auVar49,auVar53);
          auVar54 = vfmadd231ps_avx512vl(auVar55,auVar56,auVar164);
          auVar305._0_4_ = auVar50._0_4_ + auVar54._0_4_;
          auVar305._4_4_ = auVar50._4_4_ + auVar54._4_4_;
          auVar305._8_4_ = auVar50._8_4_ + auVar54._8_4_;
          auVar305._12_4_ = auVar50._12_4_ + auVar54._12_4_;
          auVar71 = vfmadd231ps_avx512vl(auVar58,auVar56,auVar71);
          auVar54 = vaddps_avx512vl(auVar65,auVar71);
          auVar62 = vfmadd231ps_avx512vl(auVar62,auVar56,auVar49);
          fVar117 = auVar69._0_4_ + auVar62._0_4_;
          fVar126 = auVar69._4_4_ + auVar62._4_4_;
          fVar127 = auVar69._8_4_ + auVar62._8_4_;
          fVar128 = auVar69._12_4_ + auVar62._12_4_;
          auVar62 = vmulps_avx512vl(auVar59,auVar70);
          auVar62 = vfmsub231ps_avx512vl(auVar62,auVar57,auVar53);
          auVar71 = vmulps_avx512vl(auVar53,auVar68);
          auVar71 = vfmsub231ps_avx512vl(auVar71,auVar70,auVar48);
          auVar49 = vmulps_avx512vl(auVar48,auVar57);
          auVar50 = vfmsub231ps_avx512vl(auVar49,auVar68,auVar59);
          auVar49 = vmulps_avx512vl(auVar61,auVar48);
          auVar69 = vfmsub231ps_avx512vl(auVar49,auVar66,auVar53);
          auVar49 = vmulps_avx512vl(auVar67,auVar53);
          auVar53 = vfmsub231ps_avx512vl(auVar49,auVar59,auVar61);
          auVar49 = vmulps_avx512vl(auVar66,auVar59);
          auVar48 = vfmsub231ps_avx512vl(auVar49,auVar67,auVar48);
          auVar165._0_4_ = auVar57._0_4_ * auVar61._0_4_;
          auVar165._4_4_ = auVar57._4_4_ * auVar61._4_4_;
          auVar165._8_4_ = auVar57._8_4_ * auVar61._8_4_;
          auVar165._12_4_ = auVar57._12_4_ * auVar61._12_4_;
          auVar55 = vfmsub231ps_avx512vl(auVar165,auVar67,auVar70);
          auVar49 = vmulps_avx512vl(auVar70,auVar66);
          auVar49 = vfmsub231ps_fma(auVar49,auVar61,auVar68);
          auVar240._0_4_ = auVar68._0_4_ * auVar67._0_4_;
          auVar240._4_4_ = auVar68._4_4_ * auVar67._4_4_;
          auVar240._8_4_ = auVar68._8_4_ * auVar67._8_4_;
          auVar240._12_4_ = auVar68._12_4_ * auVar67._12_4_;
          auVar65 = vfmsub231ps_fma(auVar240,auVar66,auVar57);
          auVar61 = vmulps_avx512vl(auVar61,auVar50);
          auVar67 = vfmadd231ps_avx512vl(auVar61,auVar71,auVar67);
          auVar70 = vfmadd231ps_avx512vl(auVar67,auVar62,auVar66);
          auVar66 = vdivps_avx512vl(auVar62,auVar70);
          auVar67 = vdivps_avx512vl(auVar53,auVar70);
          auVar61 = vdivps_avx512vl(auVar55,auVar70);
          auVar62 = vdivps_avx512vl(auVar71,auVar70);
          auVar71 = vdivps_avx512vl(auVar69,auVar70);
          auVar49 = vdivps_avx512vl(auVar49,auVar70);
          auVar68 = vdivps_avx512vl(auVar50,auVar70);
          auVar50 = vdivps_avx512vl(auVar48,auVar70);
          auVar65 = vdivps_avx512vl(auVar65,auVar70);
          auVar252._0_4_ = fVar117 * auVar68._0_4_;
          auVar252._4_4_ = fVar126 * auVar68._4_4_;
          auVar252._8_4_ = fVar127 * auVar68._8_4_;
          auVar252._12_4_ = fVar128 * auVar68._12_4_;
          auVar270._0_4_ = fVar117 * auVar50._0_4_;
          auVar270._4_4_ = fVar126 * auVar50._4_4_;
          auVar270._8_4_ = fVar127 * auVar50._8_4_;
          auVar270._12_4_ = fVar128 * auVar50._12_4_;
          auVar292._0_4_ = fVar117 * auVar65._0_4_;
          auVar292._4_4_ = fVar126 * auVar65._4_4_;
          auVar292._8_4_ = fVar127 * auVar65._8_4_;
          auVar292._12_4_ = fVar128 * auVar65._12_4_;
          auVar70 = vfmadd231ps_fma(auVar252,auVar54,auVar62);
          auVar48 = vfmadd231ps_fma(auVar270,auVar54,auVar71);
          auVar53 = vfmadd231ps_fma(auVar292,auVar49,auVar54);
          auVar69 = vfmadd231ps_fma(auVar70,auVar305,auVar66);
          auVar48 = vfmadd231ps_fma(auVar48,auVar305,auVar67);
          auVar70 = vfmadd231ps_fma(auVar53,auVar61,auVar305);
        }
        auVar273._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
        auVar273._8_4_ = auVar69._8_4_ ^ 0x80000000;
        auVar273._12_4_ = auVar69._12_4_ ^ 0x80000000;
        auVar245._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
        auVar245._8_4_ = auVar48._8_4_ ^ 0x80000000;
        auVar245._12_4_ = auVar48._12_4_ ^ 0x80000000;
        auVar257._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
        auVar257._8_4_ = auVar70._8_4_ ^ 0x80000000;
        auVar257._12_4_ = auVar70._12_4_ ^ 0x80000000;
      }
      else {
        fVar117 = (this->super_Geometry).time_range.lower;
        auVar118._4_4_ = fVar117;
        auVar118._0_4_ = fVar117;
        auVar118._8_4_ = fVar117;
        auVar118._12_4_ = fVar117;
        fVar126 = (this->super_Geometry).fnumTimeSegments;
        auVar71 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar118);
        fVar117 = (this->super_Geometry).time_range.upper - fVar117;
        auVar119._4_4_ = fVar117;
        auVar119._0_4_ = fVar117;
        auVar119._8_4_ = fVar117;
        auVar119._12_4_ = fVar117;
        auVar49 = vdivps_avx(auVar71,auVar119);
        auVar120._0_4_ = fVar126 * auVar49._0_4_;
        auVar120._4_4_ = fVar126 * auVar49._4_4_;
        auVar120._8_4_ = fVar126 * auVar49._8_4_;
        auVar120._12_4_ = fVar126 * auVar49._12_4_;
        auVar49 = vroundps_avx(auVar120,1);
        fVar126 = fVar126 + -1.0;
        auVar52._4_4_ = fVar126;
        auVar52._0_4_ = fVar126;
        auVar52._8_4_ = fVar126;
        auVar52._12_4_ = fVar126;
        auVar68 = vminps_avx(auVar49,auVar52);
        auVar49 = vxorps_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
        auVar50 = vmaxps_avx512vl(auVar68,auVar49);
        auVar68 = vsubps_avx(auVar120,auVar50);
        auVar50 = vcvtps2dq_avx512vl(auVar50);
        local_c8 = vmovdqa64_avx512vl(auVar50);
        uVar43 = 0;
        for (uVar105 = (uint)bVar37; (uVar105 & 1) == 0; uVar105 = uVar105 >> 1 | 0x80000000) {
          uVar43 = uVar43 + 1;
        }
        auVar51 = vpbroadcastd_avx512vl();
        uVar14 = vpcmpeqd_avx512vl(auVar50,auVar51);
        if ((byte)(bVar37 ^ 0xf | (byte)uVar14 & 0xf) == 0xf) {
          pRVar4 = (this->l2w_buf).items;
          pRVar6 = pRVar4 + *(int *)(local_c8 + (ulong)uVar43 * 4);
          RVar2 = pRVar4[*(int *)(local_c8 + (ulong)uVar43 * 4)].format;
          if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
            pcVar5 = pRVar6->ptr_ofs;
            lVar40 = pRVar6->stride * uVar36;
            auVar66 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40)),
                                    ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x10)),0x1c);
            auVar51 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x20)),0x28);
            auVar66 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 4)),
                                    ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x14)),0x1c);
            auVar52 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x24)),0x28);
            auVar66 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 8)),
                                    ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)),0x1c);
            auVar71 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x28)),0x28);
            auVar66 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),
                                    ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x1c)),0x1c);
            auVar66 = vinsertps_avx(auVar66,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x2c)),0x28);
          }
          else if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
            pcVar5 = pRVar6->ptr_ofs;
            lVar40 = pRVar6->stride * uVar36;
            auVar166._8_8_ = 0;
            auVar166._0_8_ = *(ulong *)(pcVar5 + lVar40 + 4);
            auVar201._8_8_ = 0;
            auVar201._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x10);
            auVar51 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40)),_DAT_01fbb140,auVar166)
            ;
            auVar52 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),_DAT_01fbb140,
                                         auVar201);
            auVar202._8_8_ = 0;
            auVar202._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x1c);
            auVar71 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)),_DAT_01fbb140,
                                         auVar202);
            auVar203._8_8_ = 0;
            auVar203._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x28);
            auVar66 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x24)),_DAT_01fbb140,
                                         auVar203);
          }
          else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar5 = pRVar6->ptr_ofs;
            lVar40 = pRVar6->stride * uVar36;
            auVar129._8_8_ = 0;
            auVar129._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x10);
            auVar71 = vinsertps_avx(auVar129,ZEXT416(*(uint *)(pcVar5 + lVar40 + 8)),0x20);
            auVar130._8_8_ = 0;
            auVar130._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x34);
            auVar50 = vpermt2ps_avx512vl(auVar130,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar5 + lVar40)))
            ;
            auVar216._8_8_ = 0;
            auVar216._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x1c);
            fVar117 = *(float *)(pcVar5 + lVar40 + 0x24);
            fVar126 = *(float *)(pcVar5 + lVar40 + 0x28);
            auVar67 = ZEXT416((uint)fVar126);
            fVar127 = *(float *)(pcVar5 + lVar40 + 0x2c);
            auVar61 = ZEXT416((uint)fVar127);
            auVar65 = vpermt2ps_avx512vl(auVar216,_DAT_01fbb150,
                                         ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)));
            fVar128 = *(float *)(pcVar5 + lVar40 + 0x30);
            auVar66 = vfmadd231ss_fma(ZEXT416((uint)(fVar126 * fVar126)),ZEXT416((uint)fVar117),
                                      ZEXT416((uint)fVar117));
            auVar66 = vfmadd231ss_fma(auVar66,ZEXT416((uint)fVar127),ZEXT416((uint)fVar127));
            auVar66 = vfmadd231ss_fma(auVar66,ZEXT416((uint)fVar128),ZEXT416((uint)fVar128));
            auVar70 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar66._0_4_));
            fVar44 = auVar70._0_4_;
            fVar44 = fVar44 * 1.5 + fVar44 * fVar44 * fVar44 * auVar66._0_4_ * -0.5;
            auVar66 = vinsertps_avx(auVar65,ZEXT416((uint)(fVar117 * fVar44)),0x30);
            auVar51 = vinsertps_avx(auVar50,ZEXT416((uint)(fVar126 * fVar44)),0x30);
            auVar71 = vinsertps_avx(auVar71,ZEXT416((uint)(fVar128 * fVar44)),0x30);
            auVar50 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),
                                    ZEXT416(*(uint *)(pcVar5 + lVar40 + 4)),0x10);
            auVar50 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x3c)),0x20);
            auVar52 = vinsertps_avx(auVar50,ZEXT416((uint)(fVar127 * fVar44)),0x30);
          }
          else if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
            pcVar5 = pRVar6->ptr_ofs;
            lVar40 = pRVar6->stride * uVar36;
            auVar51 = *(undefined1 (*) [16])(pcVar5 + lVar40);
            auVar52 = *(undefined1 (*) [16])(pcVar5 + lVar40 + 0x10);
            auVar71 = *(undefined1 (*) [16])(pcVar5 + lVar40 + 0x20);
            auVar66 = *(undefined1 (*) [16])(pcVar5 + lVar40 + 0x30);
          }
          RVar2 = pRVar6[1].format;
          if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
            pcVar5 = pRVar6[1].ptr_ofs;
            lVar40 = uVar36 * pRVar6[1].stride;
            auVar67 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40)),
                                    ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x10)),0x1c);
            auVar67 = vinsertps_avx(auVar67,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x20)),0x28);
            auVar61 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 4)),
                                    ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x14)),0x1c);
            auVar61 = vinsertps_avx(auVar61,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x24)),0x28);
            auVar62 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 8)),
                                    ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)),0x1c);
            auVar62 = vinsertps_avx(auVar62,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x28)),0x28);
            auVar49 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),
                                    ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x1c)),0x1c);
            auVar49 = vinsertps_avx512f(auVar49,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x2c)),0x28);
          }
          else if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
            pcVar5 = pRVar6[1].ptr_ofs;
            lVar40 = uVar36 * pRVar6[1].stride;
            auVar179._8_8_ = 0;
            auVar179._0_8_ = *(ulong *)(pcVar5 + lVar40 + 4);
            auVar217._8_8_ = 0;
            auVar217._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x10);
            auVar67 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40)),_DAT_01fbb140,auVar179)
            ;
            auVar61 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),_DAT_01fbb140,
                                         auVar217);
            auVar180._8_8_ = 0;
            auVar180._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x1c);
            auVar62 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)),_DAT_01fbb140,
                                         auVar180);
            auVar181._8_8_ = 0;
            auVar181._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x28);
            auVar49 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x24)),_DAT_01fbb140,
                                         auVar181);
          }
          else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar5 = pRVar6[1].ptr_ofs;
            lVar40 = uVar36 * pRVar6[1].stride;
            auVar182._8_8_ = 0;
            auVar182._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x10);
            auVar61 = vinsertps_avx(auVar182,ZEXT416(*(uint *)(pcVar5 + lVar40 + 8)),0x20);
            auVar204._8_8_ = 0;
            auVar204._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x34);
            auVar62 = vpermt2ps_avx512vl(auVar204,_DAT_01fbb150,ZEXT416(*(uint *)(pcVar5 + lVar40)))
            ;
            auVar253._8_8_ = 0;
            auVar253._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x1c);
            fVar117 = *(float *)(pcVar5 + lVar40 + 0x24);
            fVar126 = *(float *)(pcVar5 + lVar40 + 0x28);
            fVar127 = *(float *)(pcVar5 + lVar40 + 0x2c);
            auVar49 = vpermt2ps_avx512vl(auVar253,_DAT_01fbb150,
                                         ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)));
            fVar128 = *(float *)(pcVar5 + lVar40 + 0x30);
            auVar67 = vfmadd231ss_fma(ZEXT416((uint)(fVar126 * fVar126)),ZEXT416((uint)fVar117),
                                      ZEXT416((uint)fVar117));
            auVar67 = vfmadd231ss_fma(auVar67,ZEXT416((uint)fVar127),ZEXT416((uint)fVar127));
            auVar67 = vfmadd231ss_fma(auVar67,ZEXT416((uint)fVar128),ZEXT416((uint)fVar128));
            auVar300._4_12_ = ZEXT812(0) << 0x20;
            auVar300._0_4_ = auVar67._0_4_;
            auVar50 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar300);
            fVar44 = auVar50._0_4_;
            fVar44 = fVar44 * 1.5 + fVar44 * fVar44 * fVar44 * auVar67._0_4_ * -0.5;
            auVar49 = vinsertps_avx512f(auVar49,ZEXT416((uint)(fVar117 * fVar44)),0x30);
            auVar67 = vinsertps_avx(auVar62,ZEXT416((uint)(fVar126 * fVar44)),0x30);
            auVar62 = vinsertps_avx(auVar61,ZEXT416((uint)(fVar44 * fVar128)),0x30);
            auVar61 = vinsertps_avx(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),
                                    ZEXT416(*(uint *)(pcVar5 + lVar40 + 4)),0x10);
            auVar61 = vinsertps_avx(auVar61,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x3c)),0x20);
            auVar61 = vinsertps_avx(auVar61,ZEXT416((uint)(fVar127 * fVar44)),0x30);
          }
          else if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
            pcVar5 = pRVar6[1].ptr_ofs;
            lVar40 = uVar36 * pRVar6[1].stride;
            auVar67 = *(undefined1 (*) [16])(pcVar5 + lVar40);
            auVar61 = *(undefined1 (*) [16])(pcVar5 + lVar40 + 0x10);
            auVar62 = *(undefined1 (*) [16])(pcVar5 + lVar40 + 0x20);
            auVar49 = *(undefined1 (*) [16])(pcVar5 + lVar40 + 0x30);
          }
          auVar53 = vbroadcastss_avx512vl(auVar51);
          auVar54 = vshufps_avx512vl(auVar51,auVar51,0x55);
          auVar55 = vshufps_avx512vl(auVar51,auVar51,0xaa);
          uVar149 = auVar52._0_4_;
          auVar254._4_4_ = uVar149;
          auVar254._0_4_ = uVar149;
          auVar254._8_4_ = uVar149;
          auVar254._12_4_ = uVar149;
          auVar65 = vshufps_avx(auVar52,auVar52,0x55);
          auVar70 = vshufps_avx(auVar52,auVar52,0xaa);
          uVar149 = auVar71._0_4_;
          auVar183._4_4_ = uVar149;
          auVar183._0_4_ = uVar149;
          auVar183._8_4_ = uVar149;
          auVar183._12_4_ = uVar149;
          auVar48 = vshufps_avx(auVar71,auVar71,0x55);
          auVar69 = vshufps_avx(auVar71,auVar71,0xaa);
          uVar149 = auVar66._0_4_;
          auVar51._4_4_ = uVar149;
          auVar51._0_4_ = uVar149;
          auVar51._8_4_ = uVar149;
          auVar51._12_4_ = uVar149;
          auVar52 = vshufps_avx(auVar66,auVar66,0x55);
          auVar71 = vshufps_avx(auVar66,auVar66,0xaa);
          auVar56 = vbroadcastss_avx512vl(auVar67);
          auVar57 = vshufps_avx512vl(auVar67,auVar67,0x55);
          auVar58 = vshufps_avx512vl(auVar67,auVar67,0xaa);
          auVar59 = vbroadcastss_avx512vl(auVar61);
          auVar60 = vshufps_avx512vl(auVar61,auVar61,0x55);
          auVar61 = vshufps_avx512vl(auVar61,auVar61,0xaa);
          uVar149 = auVar62._0_4_;
          auVar293._4_4_ = uVar149;
          auVar293._0_4_ = uVar149;
          auVar293._8_4_ = uVar149;
          auVar293._12_4_ = uVar149;
          auVar66 = vshufps_avx(auVar62,auVar62,0x55);
          auVar67 = vshufps_avx(auVar62,auVar62,0xaa);
          auVar62 = vbroadcastss_avx512vl(auVar49);
          auVar63 = vshufps_avx512vl(auVar49,auVar49,0x55);
          auVar64 = vshufps_avx512vl(auVar49,auVar49,0xaa);
        }
        else {
          pRVar6 = (this->l2w_buf).items;
          uVar41 = uVar38 & 0xffffffff;
          while( true ) {
            auVar64 = in_ZMM9._0_16_;
            auVar67 = in_ZMM15._0_16_;
            auVar66 = in_ZMM14._0_16_;
            auVar293 = in_ZMM13._0_16_;
            auVar70 = in_ZMM12._0_16_;
            auVar65 = in_ZMM11._0_16_;
            auVar254 = in_ZMM10._0_16_;
            auVar63 = in_ZMM8._0_16_;
            auVar62 = in_ZMM7._0_16_;
            auVar69 = in_ZMM6._0_16_;
            auVar48 = in_ZMM5._0_16_;
            auVar183 = in_ZMM4._0_16_;
            auVar61 = in_ZMM21._0_16_;
            auVar60 = in_ZMM20._0_16_;
            auVar59 = in_ZMM19._0_16_;
            auVar55 = in_ZMM18._0_16_;
            auVar54 = in_ZMM17._0_16_;
            auVar53 = in_ZMM16._0_16_;
            auVar58 = in_ZMM24._0_16_;
            auVar57 = in_ZMM23._0_16_;
            auVar56 = in_ZMM22._0_16_;
            bVar37 = (byte)uVar41;
            if (bVar37 == 0) break;
            uVar43 = 0;
            for (uVar105 = (uint)uVar41 & 0xff; (uVar105 & 1) == 0;
                uVar105 = uVar105 >> 1 | 0x80000000) {
              uVar43 = uVar43 + 1;
            }
            pRVar4 = pRVar6 + *(int *)(local_c8 + (ulong)uVar43 * 4);
            RVar2 = pRVar6[*(int *)(local_c8 + (ulong)uVar43 * 4)].format;
            auVar72._4_12_ = auVar49._4_12_;
            if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar5 = pRVar4->ptr_ofs;
              lVar40 = pRVar4->stride * uVar36;
              auVar66 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar40)),
                                          ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x10)),0x1c);
              local_158 = vinsertps_avx512f(auVar66,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x20)),0x28)
              ;
              auVar66 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar40 + 4)),
                                          ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x14)),0x1c);
              local_168 = vinsertps_avx512f(auVar66,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x24)),0x28)
              ;
              auVar66 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar40 + 8)),
                                          ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)),0x1c);
              local_178 = vinsertps_avx512f(auVar66,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x28)),0x28)
              ;
              auVar66 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),
                                          ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x1c)),0x1c);
              local_148 = vinsertps_avx512f(auVar66,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x2c)),0x28)
              ;
            }
            else if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar5 = pRVar4->ptr_ofs;
              lVar40 = pRVar4->stride * uVar36;
              auVar308._8_8_ = 0;
              auVar308._0_8_ = *(ulong *)(pcVar5 + lVar40 + 4);
              local_158 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40)),_DAT_01fbb140,
                                             auVar308);
              auVar316._8_8_ = 0;
              auVar316._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x10);
              local_168 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),_DAT_01fbb140
                                             ,auVar316);
              auVar309._8_8_ = 0;
              auVar309._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x1c);
              local_178 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)),
                                             _DAT_01fbb140,auVar309);
              auVar310._8_8_ = 0;
              auVar310._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x28);
              local_148 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x24)),
                                             _DAT_01fbb140,auVar310);
            }
            else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar5 = pRVar4->ptr_ofs;
              lVar40 = pRVar4->stride * uVar36;
              auVar315._8_8_ = 0;
              auVar315._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x10);
              auVar66 = vinsertps_avx512f(auVar315,ZEXT416(*(uint *)(pcVar5 + lVar40 + 8)),0x20);
              auVar317._8_8_ = 0;
              auVar317._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x34);
              auVar67 = vpermt2ps_avx512vl(auVar317,_DAT_01fbb150,
                                           ZEXT416(*(uint *)(pcVar5 + lVar40)));
              auVar318._8_8_ = 0;
              auVar318._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x1c);
              auVar61 = vpermt2ps_avx512vl(auVar318,_DAT_01fbb150,
                                           ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)));
              uVar43 = *(uint *)(pcVar5 + lVar40 + 0x24);
              uVar105 = *(uint *)(pcVar5 + lVar40 + 0x28);
              uVar107 = *(uint *)(pcVar5 + lVar40 + 0x2c);
              uVar112 = *(uint *)(pcVar5 + lVar40 + 0x30);
              auVar62 = vmulss_avx512f(ZEXT416(uVar105),ZEXT416(uVar105));
              auVar62 = vfmadd231ss_avx512f(auVar62,ZEXT416(uVar43),ZEXT416(uVar43));
              auVar62 = vfmadd231ss_avx512f(auVar62,ZEXT416(uVar107),ZEXT416(uVar107));
              auVar62 = vfmadd231ss_avx512f(auVar62,ZEXT416(uVar112),ZEXT416(uVar112));
              auVar72._0_4_ = auVar62._0_4_;
              auVar65 = vrsqrt14ss_avx512f(auVar49,auVar72);
              auVar70 = vmulss_avx512f(auVar65,ZEXT416(0x3fc00000));
              auVar62 = vmulss_avx512f(auVar62,ZEXT416(0xbf000000));
              auVar62 = vmulss_avx512f(auVar65,auVar62);
              auVar65 = vmulss_avx512f(auVar65,auVar65);
              auVar62 = vmulss_avx512f(auVar65,auVar62);
              auVar62 = vaddss_avx512f(auVar70,auVar62);
              auVar65 = vmulss_avx512f(ZEXT416(uVar43),auVar62);
              local_148 = vinsertps_avx512f(auVar61,auVar65,0x30);
              auVar61 = vmulss_avx512f(auVar62,ZEXT416(uVar105));
              local_158 = vinsertps_avx512f(auVar67,auVar61,0x30);
              auVar67 = vmulss_avx512f(auVar62,ZEXT416(uVar107));
              auVar61 = vmulss_avx512f(auVar62,ZEXT416(uVar112));
              local_178 = vinsertps_avx512f(auVar66,auVar61,0x30);
              auVar66 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),
                                          ZEXT416(*(uint *)(pcVar5 + lVar40 + 4)),0x10);
              auVar66 = vinsertps_avx512f(auVar66,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x3c)),0x20);
              local_168 = vinsertps_avx512f(auVar66,auVar67,0x30);
            }
            else if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
              pcVar5 = pRVar4->ptr_ofs;
              lVar40 = pRVar4->stride * uVar36;
              local_158 = *(undefined1 (*) [16])(pcVar5 + lVar40);
              local_168 = *(undefined1 (*) [16])(pcVar5 + lVar40 + 0x10);
              local_178 = *(undefined1 (*) [16])(pcVar5 + lVar40 + 0x20);
              local_148 = *(undefined1 (*) [16])(pcVar5 + lVar40 + 0x30);
            }
            auVar66 = vpbroadcastd_avx512vl();
            uVar14 = vpcmpeqd_avx512vl(auVar66,auVar50);
            RVar2 = pRVar4[1].format;
            if (RVar2 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar5 = pRVar4[1].ptr_ofs;
              lVar40 = pRVar4[1].stride * uVar36;
              auVar66 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar40)),
                                          ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x10)),0x1c);
              local_188 = vinsertps_avx512f(auVar66,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x20)),0x28)
              ;
              auVar66 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar40 + 4)),
                                          ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x14)),0x1c);
              auVar66 = vinsertps_avx512f(auVar66,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x24)),0x28);
              in_ZMM28 = ZEXT1664(auVar66);
              auVar66 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar40 + 8)),
                                          ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)),0x1c);
              auVar66 = vinsertps_avx512f(auVar66,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x28)),0x28);
              in_ZMM31 = ZEXT1664(auVar66);
              auVar66 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),
                                          ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x1c)),0x1c);
              auVar66 = vinsertps_avx512f(auVar66,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x2c)),0x28);
              in_ZMM29 = ZEXT1664(auVar66);
            }
            else if (RVar2 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar5 = pRVar4[1].ptr_ofs;
              lVar40 = pRVar4[1].stride * uVar36;
              local_188._8_8_ = 0;
              local_188._0_8_ = *(ulong *)(pcVar5 + lVar40 + 4);
              local_188 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40)),_DAT_01fbb140,
                                             local_188);
              auVar311._8_8_ = 0;
              auVar311._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x10);
              auVar66 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),_DAT_01fbb140,
                                           auVar311);
              in_ZMM28 = ZEXT1664(auVar66);
              auVar312._8_8_ = 0;
              auVar312._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x1c);
              auVar66 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)),_DAT_01fbb140,
                                           auVar312);
              in_ZMM31 = ZEXT1664(auVar66);
              auVar313._8_8_ = 0;
              auVar313._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x28);
              auVar66 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x24)),_DAT_01fbb140,
                                           auVar313);
              in_ZMM29 = ZEXT1664(auVar66);
            }
            else if (RVar2 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
              pcVar5 = pRVar4[1].ptr_ofs;
              lVar40 = pRVar4[1].stride * uVar36;
              auVar314._8_8_ = 0;
              auVar314._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x10);
              auVar66 = vinsertps_avx512f(auVar314,ZEXT416(*(uint *)(pcVar5 + lVar40 + 8)),0x20);
              auVar319._8_8_ = 0;
              auVar319._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x34);
              auVar61 = vpermt2ps_avx512vl(auVar319,_DAT_01fbb150,
                                           ZEXT416(*(uint *)(pcVar5 + lVar40)));
              auVar320._8_8_ = 0;
              auVar320._0_8_ = *(ulong *)(pcVar5 + lVar40 + 0x1c);
              auVar67 = vpermt2ps_avx512vl(auVar320,_DAT_01fbb150,
                                           ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x18)));
              uVar43 = *(uint *)(pcVar5 + lVar40 + 0x24);
              uVar105 = *(uint *)(pcVar5 + lVar40 + 0x28);
              uVar107 = *(uint *)(pcVar5 + lVar40 + 0x2c);
              uVar112 = *(uint *)(pcVar5 + lVar40 + 0x30);
              auVar62 = vmulss_avx512f(ZEXT416(uVar105),ZEXT416(uVar105));
              auVar62 = vfmadd231ss_avx512f(auVar62,ZEXT416(uVar43),ZEXT416(uVar43));
              auVar62 = vfmadd231ss_avx512f(auVar62,ZEXT416(uVar107),ZEXT416(uVar107));
              auVar62 = vfmadd231ss_avx512f(auVar62,ZEXT416(uVar112),ZEXT416(uVar112));
              auVar73._4_12_ = auVar72._4_12_;
              auVar73._0_4_ = auVar62._0_4_;
              auVar65 = vrsqrt14ss_avx512f(auVar49,auVar73);
              auVar70 = vmulss_avx512f(auVar65,ZEXT416(0x3fc00000));
              auVar62 = vmulss_avx512f(auVar62,ZEXT416(0xbf000000));
              auVar62 = vmulss_avx512f(auVar65,auVar62);
              auVar65 = vmulss_avx512f(auVar65,auVar65);
              auVar62 = vmulss_avx512f(auVar65,auVar62);
              auVar62 = vaddss_avx512f(auVar70,auVar62);
              auVar65 = vmulss_avx512f(ZEXT416(uVar43),auVar62);
              auVar67 = vinsertps_avx512f(auVar67,auVar65,0x30);
              in_ZMM29 = ZEXT1664(auVar67);
              auVar67 = vmulss_avx512f(auVar62,ZEXT416(uVar105));
              local_188 = vinsertps_avx512f(auVar61,auVar67,0x30);
              auVar67 = vmulss_avx512f(auVar62,ZEXT416(uVar107));
              auVar61 = vmulss_avx512f(auVar62,ZEXT416(uVar112));
              auVar66 = vinsertps_avx512f(auVar66,auVar61,0x30);
              in_ZMM31 = ZEXT1664(auVar66);
              auVar66 = vinsertps_avx512f(ZEXT416(*(uint *)(pcVar5 + lVar40 + 0xc)),
                                          ZEXT416(*(uint *)(pcVar5 + lVar40 + 4)),0x10);
              auVar66 = vinsertps_avx512f(auVar66,ZEXT416(*(uint *)(pcVar5 + lVar40 + 0x3c)),0x20);
              auVar66 = vinsertps_avx512f(auVar66,auVar67,0x30);
              in_ZMM28 = ZEXT1664(auVar66);
            }
            else {
              in_ZMM28 = ZEXT1664(in_ZMM28._0_16_);
              in_ZMM31 = ZEXT1664(in_ZMM31._0_16_);
              in_ZMM29 = ZEXT1664(in_ZMM29._0_16_);
              if (RVar2 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
                pcVar5 = pRVar4[1].ptr_ofs;
                lVar40 = pRVar4[1].stride * uVar36;
                auVar66 = vmovdqa64_avx512vl(*(undefined1 (*) [16])(pcVar5 + lVar40));
                local_188 = vmovdqa64_avx512vl(auVar66);
                in_ZMM28 = ZEXT1664(*(undefined1 (*) [16])(pcVar5 + lVar40 + 0x10));
                in_ZMM31 = ZEXT1664(*(undefined1 (*) [16])(pcVar5 + lVar40 + 0x20));
                in_ZMM29 = ZEXT1664(*(undefined1 (*) [16])(pcVar5 + lVar40 + 0x30));
              }
            }
            bVar39 = bVar37 & (byte)uVar14 & 0xf;
            uVar41 = (ulong)(~bVar39 & bVar37);
            auVar66 = vbroadcastss_avx512vl(local_158);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM16 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM16._12_4_,
                                          CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                   (uint)!bVar8 * in_ZMM16._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                            (uint)!bVar7 * in_ZMM16._4_4_,
                                                            (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM16._0_4_))));
            auVar66 = vshufps_avx512vl(local_158,local_158,0x55);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM17 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM17._12_4_,
                                          CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                   (uint)!bVar8 * in_ZMM17._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                            (uint)!bVar7 * in_ZMM17._4_4_,
                                                            (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM17._0_4_))));
            auVar66 = vshufps_avx512vl(local_158,local_158,0xaa);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM18 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM18._12_4_,
                                          CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                   (uint)!bVar8 * in_ZMM18._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                            (uint)!bVar7 * in_ZMM18._4_4_,
                                                            (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM18._0_4_))));
            auVar66 = vbroadcastss_avx512vl(local_168);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM10 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM10._12_4_,
                                          CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                   (uint)!bVar8 * in_ZMM10._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                            (uint)!bVar7 * in_ZMM10._4_4_,
                                                            (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM10._0_4_))));
            auVar66 = vshufps_avx512vl(local_168,local_168,0x55);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM11 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM11._12_4_,
                                          CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                   (uint)!bVar8 * in_ZMM11._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                            (uint)!bVar7 * in_ZMM11._4_4_,
                                                            (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM11._0_4_))));
            auVar66 = vshufps_avx512vl(local_168,local_168,0xaa);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM12 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM12._12_4_,
                                          CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                   (uint)!bVar8 * in_ZMM12._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                            (uint)!bVar7 * in_ZMM12._4_4_,
                                                            (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM12._0_4_))));
            auVar66 = vbroadcastss_avx512vl(local_178);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM4 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                         (uint)!(bool)(bVar39 >> 3) * in_ZMM4._12_4_,
                                         CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                  (uint)!bVar8 * in_ZMM4._8_4_,
                                                  CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                           (uint)!bVar7 * in_ZMM4._4_4_,
                                                           (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                           (uint)!(bool)(bVar39 & 1) * in_ZMM4._0_4_
                                                          ))));
            auVar66 = vshufps_avx512vl(local_178,local_178,0x55);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM5 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                         (uint)!(bool)(bVar39 >> 3) * in_ZMM5._12_4_,
                                         CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                  (uint)!bVar8 * in_ZMM5._8_4_,
                                                  CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                           (uint)!bVar7 * in_ZMM5._4_4_,
                                                           (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                           (uint)!(bool)(bVar39 & 1) * in_ZMM5._0_4_
                                                          ))));
            auVar66 = vshufps_avx512vl(local_178,local_178,0xaa);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM6 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                         (uint)!(bool)(bVar39 >> 3) * in_ZMM6._12_4_,
                                         CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                  (uint)!bVar8 * in_ZMM6._8_4_,
                                                  CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                           (uint)!bVar7 * in_ZMM6._4_4_,
                                                           (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                           (uint)!(bool)(bVar39 & 1) * in_ZMM6._0_4_
                                                          ))));
            auVar66 = vbroadcastss_avx512vl(local_148);
            auVar74._0_4_ =
                 (uint)(bVar39 & 1) * auVar66._0_4_ | (uint)!(bool)(bVar39 & 1) * auVar51._0_4_;
            bVar7 = (bool)(bVar39 >> 1 & 1);
            auVar74._4_4_ = (uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * auVar51._4_4_;
            bVar7 = (bool)(bVar39 >> 2 & 1);
            auVar74._8_4_ = (uint)bVar7 * auVar66._8_4_ | (uint)!bVar7 * auVar51._8_4_;
            auVar74._12_4_ =
                 (uint)(bVar39 >> 3) * auVar66._12_4_ | (uint)!(bool)(bVar39 >> 3) * auVar51._12_4_;
            auVar66 = vshufps_avx512vl(local_148,local_148,0x55);
            auVar75._0_4_ =
                 (uint)(bVar39 & 1) * auVar66._0_4_ | (uint)!(bool)(bVar39 & 1) * auVar52._0_4_;
            bVar7 = (bool)(bVar39 >> 1 & 1);
            auVar75._4_4_ = (uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * auVar52._4_4_;
            bVar7 = (bool)(bVar39 >> 2 & 1);
            auVar75._8_4_ = (uint)bVar7 * auVar66._8_4_ | (uint)!bVar7 * auVar52._8_4_;
            auVar75._12_4_ =
                 (uint)(bVar39 >> 3) * auVar66._12_4_ | (uint)!(bool)(bVar39 >> 3) * auVar52._12_4_;
            auVar66 = vshufps_avx512vl(local_148,local_148,0xaa);
            auVar76._0_4_ =
                 (uint)(bVar39 & 1) * auVar66._0_4_ | (uint)!(bool)(bVar39 & 1) * auVar71._0_4_;
            bVar7 = (bool)(bVar39 >> 1 & 1);
            auVar76._4_4_ = (uint)bVar7 * auVar66._4_4_ | (uint)!bVar7 * auVar71._4_4_;
            bVar7 = (bool)(bVar39 >> 2 & 1);
            auVar76._8_4_ = (uint)bVar7 * auVar66._8_4_ | (uint)!bVar7 * auVar71._8_4_;
            auVar76._12_4_ =
                 (uint)(bVar39 >> 3) * auVar66._12_4_ | (uint)!(bool)(bVar39 >> 3) * auVar71._12_4_;
            auVar66 = vbroadcastss_avx512vl(local_188);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM22 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM22._12_4_,
                                          CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                   (uint)!bVar8 * in_ZMM22._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                            (uint)!bVar7 * in_ZMM22._4_4_,
                                                            (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM22._0_4_))));
            auVar66 = vshufps_avx512vl(local_188,local_188,0x55);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM23 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM23._12_4_,
                                          CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                   (uint)!bVar8 * in_ZMM23._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                            (uint)!bVar7 * in_ZMM23._4_4_,
                                                            (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM23._0_4_))));
            auVar66 = vshufps_avx512vl(local_188,local_188,0xaa);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM24 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM24._12_4_,
                                          CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                   (uint)!bVar8 * in_ZMM24._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                            (uint)!bVar7 * in_ZMM24._4_4_,
                                                            (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM24._0_4_))));
            auVar67 = in_ZMM28._0_16_;
            auVar66 = vbroadcastss_avx512vl(auVar67);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM19 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM19._12_4_,
                                          CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                   (uint)!bVar8 * in_ZMM19._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                            (uint)!bVar7 * in_ZMM19._4_4_,
                                                            (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM19._0_4_))));
            auVar66 = vshufps_avx512vl(auVar67,auVar67,0x55);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM20 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM20._12_4_,
                                          CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                   (uint)!bVar8 * in_ZMM20._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                            (uint)!bVar7 * in_ZMM20._4_4_,
                                                            (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM20._0_4_))));
            auVar66 = vshufps_avx512vl(auVar67,auVar67,0xaa);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM21 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM21._12_4_,
                                          CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                   (uint)!bVar8 * in_ZMM21._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                            (uint)!bVar7 * in_ZMM21._4_4_,
                                                            (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM21._0_4_))));
            auVar67 = in_ZMM31._0_16_;
            auVar66 = vbroadcastss_avx512vl(auVar67);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM13 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM13._12_4_,
                                          CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                   (uint)!bVar8 * in_ZMM13._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                            (uint)!bVar7 * in_ZMM13._4_4_,
                                                            (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM13._0_4_))));
            auVar66 = vshufps_avx512vl(auVar67,auVar67,0x55);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM14 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM14._12_4_,
                                          CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                   (uint)!bVar8 * in_ZMM14._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                            (uint)!bVar7 * in_ZMM14._4_4_,
                                                            (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM14._0_4_))));
            auVar66 = vshufps_avx512vl(auVar67,auVar67,0xaa);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM15 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                          (uint)!(bool)(bVar39 >> 3) * in_ZMM15._12_4_,
                                          CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                   (uint)!bVar8 * in_ZMM15._8_4_,
                                                   CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                            (uint)!bVar7 * in_ZMM15._4_4_,
                                                            (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                            (uint)!(bool)(bVar39 & 1) *
                                                            in_ZMM15._0_4_))));
            auVar67 = in_ZMM29._0_16_;
            auVar66 = vbroadcastss_avx512vl(auVar67);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM7 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                         (uint)!(bool)(bVar39 >> 3) * in_ZMM7._12_4_,
                                         CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                  (uint)!bVar8 * in_ZMM7._8_4_,
                                                  CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                           (uint)!bVar7 * in_ZMM7._4_4_,
                                                           (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                           (uint)!(bool)(bVar39 & 1) * in_ZMM7._0_4_
                                                          ))));
            auVar66 = vshufps_avx512vl(auVar67,auVar67,0x55);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM8 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                         (uint)!(bool)(bVar39 >> 3) * in_ZMM8._12_4_,
                                         CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                  (uint)!bVar8 * in_ZMM8._8_4_,
                                                  CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                           (uint)!bVar7 * in_ZMM8._4_4_,
                                                           (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                           (uint)!(bool)(bVar39 & 1) * in_ZMM8._0_4_
                                                          ))));
            auVar66 = vshufps_avx512vl(auVar67,auVar67,0xaa);
            bVar7 = (bool)(bVar39 >> 1 & 1);
            bVar8 = (bool)(bVar39 >> 2 & 1);
            in_ZMM9 = ZEXT1664(CONCAT412((uint)(bVar39 >> 3) * auVar66._12_4_ |
                                         (uint)!(bool)(bVar39 >> 3) * in_ZMM9._12_4_,
                                         CONCAT48((uint)bVar8 * auVar66._8_4_ |
                                                  (uint)!bVar8 * in_ZMM9._8_4_,
                                                  CONCAT44((uint)bVar7 * auVar66._4_4_ |
                                                           (uint)!bVar7 * in_ZMM9._4_4_,
                                                           (uint)(bVar39 & 1) * auVar66._0_4_ |
                                                           (uint)!(bool)(bVar39 & 1) * in_ZMM9._0_4_
                                                          ))));
            auVar52 = auVar75;
            auVar71 = auVar76;
            auVar51 = auVar74;
          }
        }
        auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar49 = vsubps_avx512vl(auVar49,auVar68);
        auVar50 = vmulps_avx512vl(auVar68,auVar56);
        auVar56 = vmulps_avx512vl(auVar68,auVar57);
        auVar57 = vmulps_avx512vl(auVar68,auVar58);
        auVar50 = vfmadd231ps_avx512vl(auVar50,auVar49,auVar53);
        auVar53 = vfmadd231ps_avx512vl(auVar56,auVar49,auVar54);
        auVar54 = vfmadd231ps_avx512vl(auVar57,auVar49,auVar55);
        auVar55 = vmulps_avx512vl(auVar68,auVar59);
        auVar56 = vmulps_avx512vl(auVar68,auVar60);
        auVar61 = vmulps_avx512vl(auVar68,auVar61);
        auVar55 = vfmadd231ps_avx512vl(auVar55,auVar49,auVar254);
        auVar65 = vfmadd231ps_avx512vl(auVar56,auVar49,auVar65);
        auVar61 = vfmadd231ps_avx512vl(auVar61,auVar49,auVar70);
        fVar117 = auVar68._0_4_;
        auVar255._0_4_ = auVar293._0_4_ * fVar117;
        fVar126 = auVar68._4_4_;
        auVar255._4_4_ = auVar293._4_4_ * fVar126;
        fVar127 = auVar68._8_4_;
        auVar255._8_4_ = auVar293._8_4_ * fVar127;
        fVar128 = auVar68._12_4_;
        auVar255._12_4_ = auVar293._12_4_ * fVar128;
        auVar272._0_4_ = auVar66._0_4_ * fVar117;
        auVar272._4_4_ = auVar66._4_4_ * fVar126;
        auVar272._8_4_ = auVar66._8_4_ * fVar127;
        auVar272._12_4_ = auVar66._12_4_ * fVar128;
        auVar283._0_4_ = auVar67._0_4_ * fVar117;
        auVar283._4_4_ = auVar67._4_4_ * fVar126;
        auVar283._8_4_ = auVar67._8_4_ * fVar127;
        auVar283._12_4_ = auVar67._12_4_ * fVar128;
        auVar66 = vfmadd231ps_avx512vl(auVar255,auVar49,auVar183);
        auVar67 = vfmadd231ps_avx512vl(auVar272,auVar49,auVar48);
        auVar68 = vfmadd231ps_avx512vl(auVar283,auVar49,auVar69);
        auVar294._0_4_ = fVar117 * auVar62._0_4_;
        auVar294._4_4_ = fVar126 * auVar62._4_4_;
        auVar294._8_4_ = fVar127 * auVar62._8_4_;
        auVar294._12_4_ = fVar128 * auVar62._12_4_;
        auVar298._0_4_ = auVar63._0_4_ * fVar117;
        auVar298._4_4_ = auVar63._4_4_ * fVar126;
        auVar298._8_4_ = auVar63._8_4_ * fVar127;
        auVar298._12_4_ = auVar63._12_4_ * fVar128;
        auVar244._0_4_ = auVar64._0_4_ * fVar117;
        auVar244._4_4_ = auVar64._4_4_ * fVar126;
        auVar244._8_4_ = auVar64._8_4_ * fVar127;
        auVar244._12_4_ = auVar64._12_4_ * fVar128;
        auVar56 = vfmadd231ps_avx512vl(auVar294,auVar49,auVar51);
        auVar69 = vfmadd231ps_avx512vl(auVar298,auVar49,auVar52);
        auVar70 = vfmadd231ps_avx512vl(auVar244,auVar49,auVar71);
        auVar62 = vmulps_avx512vl(auVar67,auVar61);
        auVar62 = vfmsub231ps_avx512vl(auVar62,auVar65,auVar68);
        auVar71 = vmulps_avx512vl(auVar68,auVar55);
        auVar71 = vfmsub231ps_avx512vl(auVar71,auVar61,auVar66);
        auVar49 = vmulps_avx512vl(auVar66,auVar65);
        auVar48 = vfmsub231ps_avx512vl(auVar49,auVar55,auVar67);
        auVar49 = vmulps_avx512vl(auVar53,auVar68);
        auVar49 = vfmsub231ps_avx512vl(auVar49,auVar67,auVar54);
        auVar57 = vmulps_avx512vl(auVar54,auVar66);
        auVar68 = vfmsub231ps_avx512vl(auVar57,auVar50,auVar68);
        auVar67 = vmulps_avx512vl(auVar50,auVar67);
        auVar57 = vfmsub231ps_avx512vl(auVar67,auVar53,auVar66);
        auVar66 = vmulps_avx512vl(auVar65,auVar54);
        auVar58 = vfmsub231ps_avx512vl(auVar66,auVar53,auVar61);
        auVar66 = vmulps_avx512vl(auVar61,auVar50);
        auVar59 = vfmsub231ps_avx512vl(auVar66,auVar54,auVar55);
        auVar66 = vmulps_avx512vl(auVar55,auVar53);
        auVar65 = vfmsub231ps_avx512vl(auVar66,auVar50,auVar65);
        auVar66 = vmulps_avx512vl(auVar54,auVar48);
        auVar66 = vfmadd231ps_avx512vl(auVar66,auVar71,auVar53);
        auVar53 = vfmadd231ps_avx512vl(auVar66,auVar62,auVar50);
        auVar66 = vdivps_avx(auVar62,auVar53);
        auVar67 = vdivps_avx(auVar49,auVar53);
        auVar61 = vdivps_avx(auVar58,auVar53);
        auVar62 = vdivps_avx(auVar71,auVar53);
        auVar71 = vdivps_avx(auVar68,auVar53);
        auVar49 = vdivps_avx(auVar59,auVar53);
        auVar68 = vdivps_avx(auVar48,auVar53);
        auVar50 = vdivps_avx(auVar57,auVar53);
        auVar65 = vdivps_avx(auVar65,auVar53);
        fVar117 = auVar70._0_4_;
        auVar256._0_4_ = fVar117 * auVar68._0_4_;
        fVar126 = auVar70._4_4_;
        auVar256._4_4_ = fVar126 * auVar68._4_4_;
        fVar127 = auVar70._8_4_;
        auVar256._8_4_ = fVar127 * auVar68._8_4_;
        fVar128 = auVar70._12_4_;
        auVar256._12_4_ = fVar128 * auVar68._12_4_;
        auVar284._0_4_ = fVar117 * auVar50._0_4_;
        auVar284._4_4_ = fVar126 * auVar50._4_4_;
        auVar284._8_4_ = fVar127 * auVar50._8_4_;
        auVar284._12_4_ = fVar128 * auVar50._12_4_;
        auVar301._0_4_ = fVar117 * auVar65._0_4_;
        auVar301._4_4_ = fVar126 * auVar65._4_4_;
        auVar301._8_4_ = fVar127 * auVar65._8_4_;
        auVar301._12_4_ = fVar128 * auVar65._12_4_;
        auVar70 = vfmadd231ps_fma(auVar256,auVar69,auVar62);
        auVar48 = vfmadd231ps_fma(auVar284,auVar69,auVar71);
        auVar69 = vfmadd231ps_fma(auVar301,auVar49,auVar69);
        auVar70 = vfmadd231ps_fma(auVar70,auVar56,auVar66);
        auVar48 = vfmadd231ps_fma(auVar48,auVar56,auVar67);
        auVar69 = vfmadd231ps_fma(auVar69,auVar61,auVar56);
        auVar273._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
        auVar273._8_4_ = auVar70._8_4_ ^ 0x80000000;
        auVar273._12_4_ = auVar70._12_4_ ^ 0x80000000;
        auVar245._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
        auVar245._8_4_ = auVar48._8_4_ ^ 0x80000000;
        auVar245._12_4_ = auVar48._12_4_ ^ 0x80000000;
        auVar257._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
        auVar257._8_4_ = auVar69._8_4_ ^ 0x80000000;
        auVar257._12_4_ = auVar69._12_4_ ^ 0x80000000;
      }
      auVar70 = *(undefined1 (*) [16])ray;
      auVar48 = *(undefined1 (*) [16])(ray + 0x10);
      auVar69 = *(undefined1 (*) [16])(ray + 0x20);
      auVar53 = *(undefined1 (*) [16])(ray + 0x40);
      auVar54 = *(undefined1 (*) [16])(ray + 0x50);
      auVar55 = *(undefined1 (*) [16])(ray + 0x60);
      auVar56 = vfmadd231ps_fma(auVar273,auVar69,auVar68);
      auVar57 = vfmadd231ps_fma(auVar245,auVar69,auVar50);
      auVar58 = vfmadd231ps_fma(auVar257,auVar69,auVar65);
      auVar56 = vfmadd231ps_fma(auVar56,auVar48,auVar62);
      auVar57 = vfmadd231ps_fma(auVar57,auVar48,auVar71);
      auVar58 = vfmadd231ps_fma(auVar58,auVar48,auVar49);
      auVar56 = vfmadd231ps_fma(auVar56,auVar70,auVar66);
      auVar57 = vfmadd231ps_fma(auVar57,auVar70,auVar67);
      *(undefined1 (*) [16])ray = auVar56;
      auVar56 = vfmadd231ps_fma(auVar58,auVar70,auVar61);
      *(undefined1 (*) [16])(ray + 0x10) = auVar57;
      *(undefined1 (*) [16])(ray + 0x20) = auVar56;
      auVar68 = vmulps_avx512vl(auVar68,auVar55);
      auVar50 = vmulps_avx512vl(auVar50,auVar55);
      auVar65 = vmulps_avx512vl(auVar65,auVar55);
      auVar62 = vfmadd231ps_avx512vl(auVar68,auVar54,auVar62);
      auVar71 = vfmadd231ps_avx512vl(auVar50,auVar54,auVar71);
      auVar49 = vfmadd231ps_avx512vl(auVar65,auVar54,auVar49);
      auVar66 = vfmadd231ps_fma(auVar62,auVar53,auVar66);
      auVar67 = vfmadd231ps_fma(auVar71,auVar53,auVar67);
      auVar61 = vfmadd231ps_fma(auVar49,auVar53,auVar61);
      *(undefined1 (*) [16])(ray + 0x40) = auVar66;
      *(undefined1 (*) [16])(ray + 0x50) = auVar67;
      *(undefined1 (*) [16])(ray + 0x60) = auVar61;
      local_b8 = context->args;
      local_c8._8_8_ = pRVar3;
      local_c8._0_8_ = pAVar35;
      local_48 = vpmovm2d_avx512vl(uVar38 & 0xffffffff);
      (**(code **)&pAVar35->field_0x98)(local_48,&(pAVar35->super_AccelData).field_0x58,ray);
      local_168._0_8_ = auVar70._0_8_;
      local_168._8_8_ = auVar70._8_8_;
      *(undefined8 *)ray = local_168._0_8_;
      *(undefined8 *)(ray + 8) = local_168._8_8_;
      local_158._0_8_ = auVar48._0_8_;
      local_158._8_8_ = auVar48._8_8_;
      *(undefined8 *)(ray + 0x10) = local_158._0_8_;
      *(undefined8 *)(ray + 0x18) = local_158._8_8_;
      local_188._0_8_ = auVar69._0_8_;
      local_188._8_8_ = auVar69._8_8_;
      *(undefined8 *)(ray + 0x20) = local_188._0_8_;
      *(undefined8 *)(ray + 0x28) = local_188._8_8_;
      local_138._0_8_ = auVar53._0_8_;
      local_138._8_8_ = auVar53._8_8_;
      *(undefined8 *)(ray + 0x40) = local_138._0_8_;
      *(undefined8 *)(ray + 0x48) = local_138._8_8_;
      local_148._0_8_ = auVar54._0_8_;
      local_148._8_8_ = auVar54._8_8_;
      *(undefined8 *)(ray + 0x50) = local_148._0_8_;
      *(undefined8 *)(ray + 0x58) = local_148._8_8_;
      local_178._0_8_ = auVar55._0_8_;
      local_178._8_8_ = auVar55._8_8_;
      *(undefined8 *)(ray + 0x60) = local_178._0_8_;
      *(undefined8 *)(ray + 0x68) = local_178._8_8_;
      pRVar3->instID[0] = 0xffffffff;
      pRVar3->instPrimID[0] = 0xffffffff;
    }
  }
  return;
}

Assistant:

void InstanceArrayIntersectorKMB<K>::intersect(const vbool<K>& valid_i, const Precalculations& pre, RayHitK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(prim.primID_, valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }